

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::sse2::CurveNiIntersectorK<4,4>::
     occluded_t<embree::sse2::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,4>,embree::sse2::Occluded1KEpilogMU<4,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  undefined1 (*pauVar3) [12];
  Primitive *pPVar4;
  Primitive PVar5;
  undefined4 uVar6;
  int iVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined6 uVar15;
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  bool bVar31;
  bool bVar32;
  bool bVar33;
  int iVar34;
  RTCFilterFunctionN p_Var35;
  RTCRayN *pRVar36;
  undefined1 *puVar37;
  ulong uVar38;
  Geometry *pGVar39;
  Geometry *geometry;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  bool bVar44;
  bool bVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  short sVar52;
  float fVar53;
  float fVar54;
  undefined2 uVar87;
  float fVar88;
  float fVar91;
  undefined1 auVar56 [16];
  undefined1 auVar59 [16];
  undefined1 auVar62 [16];
  float fVar89;
  float fVar92;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar69 [16];
  undefined1 auVar72 [16];
  undefined1 auVar75 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar55;
  float fVar90;
  float fVar93;
  float fVar94;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar95;
  float fVar96;
  float fVar109;
  float fVar111;
  vfloat4 v;
  undefined1 auVar97 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar110;
  float fVar112;
  float fVar113;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar114;
  float fVar120;
  float fVar121;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar122;
  float fVar123;
  float fVar131;
  float fVar135;
  undefined1 auVar124 [16];
  float fVar132;
  float fVar133;
  float fVar136;
  float fVar137;
  float fVar139;
  float fVar140;
  undefined1 auVar125 [16];
  float fVar134;
  float fVar138;
  float fVar141;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar142;
  float fVar154;
  float fVar155;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar156;
  float fVar157;
  undefined8 uVar158;
  float fVar173;
  undefined1 auVar159 [16];
  float fVar171;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar172;
  float fVar174;
  float fVar176;
  undefined1 auVar167 [16];
  undefined8 uVar175;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar177;
  float fVar178;
  undefined8 uVar179;
  float fVar184;
  float fVar186;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar185;
  float fVar187;
  float fVar189;
  undefined1 auVar182 [16];
  undefined8 uVar188;
  undefined1 auVar183 [16];
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  undefined1 auVar193 [16];
  undefined1 auVar196 [16];
  undefined1 auVar199 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar206 [16];
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar220;
  float fVar221;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar222;
  float fVar225;
  float fVar226;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar238;
  float fVar241;
  undefined1 auVar233 [16];
  float fVar244;
  undefined1 auVar236 [16];
  float fVar239;
  float fVar240;
  float fVar242;
  float fVar243;
  float fVar245;
  float fVar246;
  undefined1 auVar237 [16];
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar253;
  float fVar256;
  float fVar259;
  undefined1 auVar250 [16];
  float fVar254;
  float fVar255;
  float fVar257;
  float fVar258;
  float fVar260;
  float fVar261;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  float fVar270;
  undefined1 auVar269 [16];
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_4> bhit;
  bool local_4e9;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  float fStack_480;
  float local_418;
  float fStack_414;
  float fStack_410;
  uint local_3d8;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  ulong local_390;
  undefined8 local_388;
  undefined8 uStack_380;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined1 (*local_320) [16];
  RTCFilterFunctionNArguments local_318;
  undefined1 local_2e8 [16];
  undefined8 local_2d8;
  uint uStack_2d0;
  uint uStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  LinearSpace3fa *local_230;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  uint local_1f8;
  int local_1f4;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined1 local_1a8 [16];
  float local_198 [4];
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 uVar86;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  
  PVar5 = prim[1];
  uVar41 = (ulong)(byte)PVar5;
  pPVar4 = prim + uVar41 * 0x19 + 6;
  fVar121 = *(float *)(pPVar4 + 0xc);
  fVar122 = (*(float *)(ray + k * 4) - *(float *)pPVar4) * fVar121;
  fVar131 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar4 + 4)) * fVar121;
  fVar135 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar4 + 8)) * fVar121;
  fVar114 = *(float *)(ray + k * 4 + 0x40) * fVar121;
  fVar120 = *(float *)(ray + k * 4 + 0x50) * fVar121;
  fVar121 = *(float *)(ray + k * 4 + 0x60) * fVar121;
  uVar6 = *(undefined4 *)(prim + uVar41 * 4 + 6);
  uVar86 = (undefined1)((uint)uVar6 >> 0x18);
  uVar87 = CONCAT11(uVar86,uVar86);
  uVar86 = (undefined1)((uint)uVar6 >> 0x10);
  uVar11 = CONCAT35(CONCAT21(uVar87,uVar86),CONCAT14(uVar86,uVar6));
  uVar86 = (undefined1)((uint)uVar6 >> 8);
  uVar15 = CONCAT51(CONCAT41((int)((ulong)uVar11 >> 0x20),uVar86),uVar86);
  sVar52 = CONCAT11((char)uVar6,(char)uVar6);
  uVar43 = CONCAT62(uVar15,sVar52);
  auVar165._8_4_ = 0;
  auVar165._0_8_ = uVar43;
  auVar165._12_2_ = uVar87;
  auVar165._14_2_ = uVar87;
  uVar87 = (undefined2)((ulong)uVar11 >> 0x20);
  auVar164._12_4_ = auVar165._12_4_;
  auVar164._8_2_ = 0;
  auVar164._0_8_ = uVar43;
  auVar164._10_2_ = uVar87;
  auVar65._10_6_ = auVar164._10_6_;
  auVar65._8_2_ = uVar87;
  auVar65._0_8_ = uVar43;
  uVar87 = (undefined2)uVar15;
  auVar16._4_8_ = auVar65._8_8_;
  auVar16._2_2_ = uVar87;
  auVar16._0_2_ = uVar87;
  fVar95 = (float)((int)sVar52 >> 8);
  fVar109 = (float)(auVar16._0_4_ >> 0x18);
  fVar111 = (float)(auVar65._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar41 * 5 + 6);
  uVar86 = (undefined1)((uint)uVar6 >> 0x18);
  uVar87 = CONCAT11(uVar86,uVar86);
  uVar86 = (undefined1)((uint)uVar6 >> 0x10);
  uVar11 = CONCAT35(CONCAT21(uVar87,uVar86),CONCAT14(uVar86,uVar6));
  uVar86 = (undefined1)((uint)uVar6 >> 8);
  uVar15 = CONCAT51(CONCAT41((int)((ulong)uVar11 >> 0x20),uVar86),uVar86);
  sVar52 = CONCAT11((char)uVar6,(char)uVar6);
  uVar43 = CONCAT62(uVar15,sVar52);
  auVar58._8_4_ = 0;
  auVar58._0_8_ = uVar43;
  auVar58._12_2_ = uVar87;
  auVar58._14_2_ = uVar87;
  uVar87 = (undefined2)((ulong)uVar11 >> 0x20);
  auVar57._12_4_ = auVar58._12_4_;
  auVar57._8_2_ = 0;
  auVar57._0_8_ = uVar43;
  auVar57._10_2_ = uVar87;
  auVar56._10_6_ = auVar57._10_6_;
  auVar56._8_2_ = uVar87;
  auVar56._0_8_ = uVar43;
  uVar87 = (undefined2)uVar15;
  auVar17._4_8_ = auVar56._8_8_;
  auVar17._2_2_ = uVar87;
  auVar17._0_2_ = uVar87;
  fVar142 = (float)((int)sVar52 >> 8);
  fVar154 = (float)(auVar17._0_4_ >> 0x18);
  fVar155 = (float)(auVar56._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar41 * 6 + 6);
  uVar86 = (undefined1)((uint)uVar6 >> 0x18);
  uVar87 = CONCAT11(uVar86,uVar86);
  uVar86 = (undefined1)((uint)uVar6 >> 0x10);
  uVar11 = CONCAT35(CONCAT21(uVar87,uVar86),CONCAT14(uVar86,uVar6));
  uVar86 = (undefined1)((uint)uVar6 >> 8);
  uVar15 = CONCAT51(CONCAT41((int)((ulong)uVar11 >> 0x20),uVar86),uVar86);
  sVar52 = CONCAT11((char)uVar6,(char)uVar6);
  uVar43 = CONCAT62(uVar15,sVar52);
  auVar61._8_4_ = 0;
  auVar61._0_8_ = uVar43;
  auVar61._12_2_ = uVar87;
  auVar61._14_2_ = uVar87;
  uVar87 = (undefined2)((ulong)uVar11 >> 0x20);
  auVar60._12_4_ = auVar61._12_4_;
  auVar60._8_2_ = 0;
  auVar60._0_8_ = uVar43;
  auVar60._10_2_ = uVar87;
  auVar59._10_6_ = auVar60._10_6_;
  auVar59._8_2_ = uVar87;
  auVar59._0_8_ = uVar43;
  uVar87 = (undefined2)uVar15;
  auVar18._4_8_ = auVar59._8_8_;
  auVar18._2_2_ = uVar87;
  auVar18._0_2_ = uVar87;
  fVar177 = (float)((int)sVar52 >> 8);
  fVar184 = (float)(auVar18._0_4_ >> 0x18);
  fVar186 = (float)(auVar59._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar41 * 0xb + 6);
  uVar86 = (undefined1)((uint)uVar6 >> 0x18);
  uVar87 = CONCAT11(uVar86,uVar86);
  uVar86 = (undefined1)((uint)uVar6 >> 0x10);
  uVar11 = CONCAT35(CONCAT21(uVar87,uVar86),CONCAT14(uVar86,uVar6));
  uVar86 = (undefined1)((uint)uVar6 >> 8);
  uVar15 = CONCAT51(CONCAT41((int)((ulong)uVar11 >> 0x20),uVar86),uVar86);
  sVar52 = CONCAT11((char)uVar6,(char)uVar6);
  uVar43 = CONCAT62(uVar15,sVar52);
  auVar64._8_4_ = 0;
  auVar64._0_8_ = uVar43;
  auVar64._12_2_ = uVar87;
  auVar64._14_2_ = uVar87;
  uVar87 = (undefined2)((ulong)uVar11 >> 0x20);
  auVar63._12_4_ = auVar64._12_4_;
  auVar63._8_2_ = 0;
  auVar63._0_8_ = uVar43;
  auVar63._10_2_ = uVar87;
  auVar62._10_6_ = auVar63._10_6_;
  auVar62._8_2_ = uVar87;
  auVar62._0_8_ = uVar43;
  uVar87 = (undefined2)uVar15;
  auVar19._4_8_ = auVar62._8_8_;
  auVar19._2_2_ = uVar87;
  auVar19._0_2_ = uVar87;
  fVar53 = (float)((int)sVar52 >> 8);
  fVar88 = (float)(auVar19._0_4_ >> 0x18);
  fVar91 = (float)(auVar62._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6);
  uVar86 = (undefined1)((uint)uVar6 >> 0x18);
  uVar87 = CONCAT11(uVar86,uVar86);
  uVar86 = (undefined1)((uint)uVar6 >> 0x10);
  uVar11 = CONCAT35(CONCAT21(uVar87,uVar86),CONCAT14(uVar86,uVar6));
  uVar86 = (undefined1)((uint)uVar6 >> 8);
  uVar15 = CONCAT51(CONCAT41((int)((ulong)uVar11 >> 0x20),uVar86),uVar86);
  sVar52 = CONCAT11((char)uVar6,(char)uVar6);
  uVar43 = CONCAT62(uVar15,sVar52);
  auVar161._8_4_ = 0;
  auVar161._0_8_ = uVar43;
  auVar161._12_2_ = uVar87;
  auVar161._14_2_ = uVar87;
  uVar87 = (undefined2)((ulong)uVar11 >> 0x20);
  auVar160._12_4_ = auVar161._12_4_;
  auVar160._8_2_ = 0;
  auVar160._0_8_ = uVar43;
  auVar160._10_2_ = uVar87;
  auVar159._10_6_ = auVar160._10_6_;
  auVar159._8_2_ = uVar87;
  auVar159._0_8_ = uVar43;
  uVar87 = (undefined2)uVar15;
  auVar20._4_8_ = auVar159._8_8_;
  auVar20._2_2_ = uVar87;
  auVar20._0_2_ = uVar87;
  fVar156 = (float)((int)sVar52 >> 8);
  fVar171 = (float)(auVar20._0_4_ >> 0x18);
  fVar173 = (float)(auVar159._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + (uint)(byte)PVar5 * 0xc + uVar41 + 6);
  uVar86 = (undefined1)((uint)uVar6 >> 0x18);
  uVar87 = CONCAT11(uVar86,uVar86);
  uVar86 = (undefined1)((uint)uVar6 >> 0x10);
  uVar11 = CONCAT35(CONCAT21(uVar87,uVar86),CONCAT14(uVar86,uVar6));
  uVar86 = (undefined1)((uint)uVar6 >> 8);
  uVar15 = CONCAT51(CONCAT41((int)((ulong)uVar11 >> 0x20),uVar86),uVar86);
  sVar52 = CONCAT11((char)uVar6,(char)uVar6);
  uVar43 = CONCAT62(uVar15,sVar52);
  auVar195._8_4_ = 0;
  auVar195._0_8_ = uVar43;
  auVar195._12_2_ = uVar87;
  auVar195._14_2_ = uVar87;
  uVar87 = (undefined2)((ulong)uVar11 >> 0x20);
  auVar194._12_4_ = auVar195._12_4_;
  auVar194._8_2_ = 0;
  auVar194._0_8_ = uVar43;
  auVar194._10_2_ = uVar87;
  auVar193._10_6_ = auVar194._10_6_;
  auVar193._8_2_ = uVar87;
  auVar193._0_8_ = uVar43;
  uVar87 = (undefined2)uVar15;
  auVar21._4_8_ = auVar193._8_8_;
  auVar21._2_2_ = uVar87;
  auVar21._0_2_ = uVar87;
  fVar222 = (float)((int)sVar52 >> 8);
  fVar225 = (float)(auVar21._0_4_ >> 0x18);
  fVar226 = (float)(auVar193._8_4_ >> 0x18);
  uVar42 = (ulong)(uint)((int)(uVar41 * 9) * 2);
  uVar6 = *(undefined4 *)(prim + uVar42 + 6);
  uVar86 = (undefined1)((uint)uVar6 >> 0x18);
  uVar87 = CONCAT11(uVar86,uVar86);
  uVar86 = (undefined1)((uint)uVar6 >> 0x10);
  uVar11 = CONCAT35(CONCAT21(uVar87,uVar86),CONCAT14(uVar86,uVar6));
  uVar86 = (undefined1)((uint)uVar6 >> 8);
  uVar15 = CONCAT51(CONCAT41((int)((ulong)uVar11 >> 0x20),uVar86),uVar86);
  sVar52 = CONCAT11((char)uVar6,(char)uVar6);
  uVar43 = CONCAT62(uVar15,sVar52);
  auVar198._8_4_ = 0;
  auVar198._0_8_ = uVar43;
  auVar198._12_2_ = uVar87;
  auVar198._14_2_ = uVar87;
  uVar87 = (undefined2)((ulong)uVar11 >> 0x20);
  auVar197._12_4_ = auVar198._12_4_;
  auVar197._8_2_ = 0;
  auVar197._0_8_ = uVar43;
  auVar197._10_2_ = uVar87;
  auVar196._10_6_ = auVar197._10_6_;
  auVar196._8_2_ = uVar87;
  auVar196._0_8_ = uVar43;
  uVar87 = (undefined2)uVar15;
  auVar22._4_8_ = auVar196._8_8_;
  auVar22._2_2_ = uVar87;
  auVar22._0_2_ = uVar87;
  fVar215 = (float)((int)sVar52 >> 8);
  fVar220 = (float)(auVar22._0_4_ >> 0x18);
  fVar221 = (float)(auVar196._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar42 + uVar41 + 6);
  uVar86 = (undefined1)((uint)uVar6 >> 0x18);
  uVar87 = CONCAT11(uVar86,uVar86);
  uVar86 = (undefined1)((uint)uVar6 >> 0x10);
  uVar11 = CONCAT35(CONCAT21(uVar87,uVar86),CONCAT14(uVar86,uVar6));
  uVar86 = (undefined1)((uint)uVar6 >> 8);
  uVar15 = CONCAT51(CONCAT41((int)((ulong)uVar11 >> 0x20),uVar86),uVar86);
  sVar52 = CONCAT11((char)uVar6,(char)uVar6);
  uVar43 = CONCAT62(uVar15,sVar52);
  auVar201._8_4_ = 0;
  auVar201._0_8_ = uVar43;
  auVar201._12_2_ = uVar87;
  auVar201._14_2_ = uVar87;
  uVar87 = (undefined2)((ulong)uVar11 >> 0x20);
  auVar200._12_4_ = auVar201._12_4_;
  auVar200._8_2_ = 0;
  auVar200._0_8_ = uVar43;
  auVar200._10_2_ = uVar87;
  auVar199._10_6_ = auVar200._10_6_;
  auVar199._8_2_ = uVar87;
  auVar199._0_8_ = uVar43;
  uVar87 = (undefined2)uVar15;
  auVar23._4_8_ = auVar199._8_8_;
  auVar23._2_2_ = uVar87;
  auVar23._0_2_ = uVar87;
  fVar227 = (float)((int)sVar52 >> 8);
  fVar228 = (float)(auVar23._0_4_ >> 0x18);
  fVar229 = (float)(auVar199._8_4_ >> 0x18);
  uVar38 = (ulong)(uint)((int)(uVar41 * 5) << 2);
  fVar271 = fVar120 * fVar156 + fVar121 * fVar222;
  fVar273 = fVar120 * fVar171 + fVar121 * fVar225;
  fVar275 = fVar120 * fVar173 + fVar121 * fVar226;
  fVar277 = fVar120 * (float)(auVar160._12_4_ >> 0x18) + fVar121 * (float)(auVar194._12_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar38 + 6);
  uVar86 = (undefined1)((uint)uVar6 >> 0x18);
  uVar87 = CONCAT11(uVar86,uVar86);
  uVar86 = (undefined1)((uint)uVar6 >> 0x10);
  uVar11 = CONCAT35(CONCAT21(uVar87,uVar86),CONCAT14(uVar86,uVar6));
  uVar86 = (undefined1)((uint)uVar6 >> 8);
  uVar15 = CONCAT51(CONCAT41((int)((ulong)uVar11 >> 0x20),uVar86),uVar86);
  sVar52 = CONCAT11((char)uVar6,(char)uVar6);
  uVar43 = CONCAT62(uVar15,sVar52);
  auVar235._8_4_ = 0;
  auVar235._0_8_ = uVar43;
  auVar235._12_2_ = uVar87;
  auVar235._14_2_ = uVar87;
  uVar87 = (undefined2)((ulong)uVar11 >> 0x20);
  auVar234._12_4_ = auVar235._12_4_;
  auVar234._8_2_ = 0;
  auVar234._0_8_ = uVar43;
  auVar234._10_2_ = uVar87;
  auVar233._10_6_ = auVar234._10_6_;
  auVar233._8_2_ = uVar87;
  auVar233._0_8_ = uVar43;
  uVar87 = (undefined2)uVar15;
  auVar24._4_8_ = auVar233._8_8_;
  auVar24._2_2_ = uVar87;
  auVar24._0_2_ = uVar87;
  fVar54 = (float)((int)sVar52 >> 8);
  fVar89 = (float)(auVar24._0_4_ >> 0x18);
  fVar92 = (float)(auVar233._8_4_ >> 0x18);
  fVar247 = fVar114 * fVar95 + fVar120 * fVar142 + fVar121 * fVar177;
  fVar253 = fVar114 * fVar109 + fVar120 * fVar154 + fVar121 * fVar184;
  fVar256 = fVar114 * fVar111 + fVar120 * fVar155 + fVar121 * fVar186;
  fVar259 = fVar114 * (float)(auVar164._12_4_ >> 0x18) +
            fVar120 * (float)(auVar57._12_4_ >> 0x18) + fVar121 * (float)(auVar60._12_4_ >> 0x18);
  fVar230 = fVar114 * fVar53 + fVar271;
  fVar238 = fVar114 * fVar88 + fVar273;
  fVar241 = fVar114 * fVar91 + fVar275;
  fVar244 = fVar114 * (float)(auVar63._12_4_ >> 0x18) + fVar277;
  fVar190 = fVar114 * fVar215 + fVar120 * fVar227 + fVar121 * fVar54;
  fVar207 = fVar114 * fVar220 + fVar120 * fVar228 + fVar121 * fVar89;
  fVar210 = fVar114 * fVar221 + fVar120 * fVar229 + fVar121 * fVar92;
  fVar114 = fVar114 * (float)(auVar197._12_4_ >> 0x18) +
            fVar120 * (float)(auVar200._12_4_ >> 0x18) + fVar121 * (float)(auVar234._12_4_ >> 0x18);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar142 = fVar95 * fVar122 + fVar142 * fVar131 + fVar177 * fVar135;
  fVar154 = fVar109 * fVar122 + fVar154 * fVar131 + fVar184 * fVar135;
  fVar155 = fVar111 * fVar122 + fVar155 * fVar131 + fVar186 * fVar135;
  fVar177 = (float)(auVar164._12_4_ >> 0x18) * fVar122 +
            (float)(auVar57._12_4_ >> 0x18) * fVar131 + (float)(auVar60._12_4_ >> 0x18) * fVar135;
  fVar184 = fVar53 * fVar122 + fVar156 * fVar131 + fVar222 * fVar135;
  fVar186 = fVar88 * fVar122 + fVar171 * fVar131 + fVar225 * fVar135;
  fVar222 = fVar91 * fVar122 + fVar173 * fVar131 + fVar226 * fVar135;
  fVar225 = (float)(auVar63._12_4_ >> 0x18) * fVar122 +
            (float)(auVar160._12_4_ >> 0x18) * fVar131 + (float)(auVar194._12_4_ >> 0x18) * fVar135;
  fVar156 = fVar122 * fVar215 + fVar131 * fVar227 + fVar135 * fVar54;
  fVar171 = fVar122 * fVar220 + fVar131 * fVar228 + fVar135 * fVar89;
  fVar173 = fVar122 * fVar221 + fVar131 * fVar229 + fVar135 * fVar92;
  fVar122 = fVar122 * (float)(auVar197._12_4_ >> 0x18) +
            fVar131 * (float)(auVar200._12_4_ >> 0x18) + fVar135 * (float)(auVar234._12_4_ >> 0x18);
  fVar121 = (float)DAT_01ff1d40;
  fVar53 = DAT_01ff1d40._4_4_;
  fVar54 = DAT_01ff1d40._8_4_;
  fVar88 = DAT_01ff1d40._12_4_;
  uVar46 = -(uint)(fVar121 <= ABS(fVar247));
  uVar47 = -(uint)(fVar53 <= ABS(fVar253));
  uVar48 = -(uint)(fVar54 <= ABS(fVar256));
  uVar50 = -(uint)(fVar88 <= ABS(fVar259));
  auVar250._0_4_ = (uint)fVar247 & uVar46;
  auVar250._4_4_ = (uint)fVar253 & uVar47;
  auVar250._8_4_ = (uint)fVar256 & uVar48;
  auVar250._12_4_ = (uint)fVar259 & uVar50;
  auVar143._0_4_ = ~uVar46 & (uint)fVar121;
  auVar143._4_4_ = ~uVar47 & (uint)fVar53;
  auVar143._8_4_ = ~uVar48 & (uint)fVar54;
  auVar143._12_4_ = ~uVar50 & (uint)fVar88;
  auVar143 = auVar143 | auVar250;
  uVar46 = -(uint)(fVar121 <= ABS(fVar230));
  uVar47 = -(uint)(fVar53 <= ABS(fVar238));
  uVar48 = -(uint)(fVar54 <= ABS(fVar241));
  uVar50 = -(uint)(fVar88 <= ABS(fVar244));
  auVar236._0_4_ = (uint)fVar230 & uVar46;
  auVar236._4_4_ = (uint)fVar238 & uVar47;
  auVar236._8_4_ = (uint)fVar241 & uVar48;
  auVar236._12_4_ = (uint)fVar244 & uVar50;
  auVar162._0_4_ = ~uVar46 & (uint)fVar121;
  auVar162._4_4_ = ~uVar47 & (uint)fVar53;
  auVar162._8_4_ = ~uVar48 & (uint)fVar54;
  auVar162._12_4_ = ~uVar50 & (uint)fVar88;
  auVar162 = auVar162 | auVar236;
  uVar46 = -(uint)(fVar121 <= ABS(fVar190));
  uVar47 = -(uint)(fVar53 <= ABS(fVar207));
  uVar48 = -(uint)(fVar54 <= ABS(fVar210));
  uVar50 = -(uint)(fVar88 <= ABS(fVar114));
  auVar202._0_4_ = (uint)fVar190 & uVar46;
  auVar202._4_4_ = (uint)fVar207 & uVar47;
  auVar202._8_4_ = (uint)fVar210 & uVar48;
  auVar202._12_4_ = (uint)fVar114 & uVar50;
  auVar180._0_4_ = ~uVar46 & (uint)fVar121;
  auVar180._4_4_ = ~uVar47 & (uint)fVar53;
  auVar180._8_4_ = ~uVar48 & (uint)fVar54;
  auVar180._12_4_ = ~uVar50 & (uint)fVar88;
  auVar180 = auVar180 | auVar202;
  auVar65 = rcpps(_DAT_01ff1d40,auVar143);
  fVar121 = auVar65._0_4_;
  fVar88 = auVar65._4_4_;
  fVar92 = auVar65._8_4_;
  fVar111 = auVar65._12_4_;
  fVar121 = (1.0 - auVar143._0_4_ * fVar121) * fVar121 + fVar121;
  fVar88 = (1.0 - auVar143._4_4_ * fVar88) * fVar88 + fVar88;
  fVar92 = (1.0 - auVar143._8_4_ * fVar92) * fVar92 + fVar92;
  fVar111 = (1.0 - auVar143._12_4_ * fVar111) * fVar111 + fVar111;
  auVar65 = rcpps(auVar65,auVar162);
  fVar53 = auVar65._0_4_;
  fVar89 = auVar65._4_4_;
  fVar95 = auVar65._8_4_;
  fVar114 = auVar65._12_4_;
  fVar53 = (1.0 - auVar162._0_4_ * fVar53) * fVar53 + fVar53;
  fVar89 = (1.0 - auVar162._4_4_ * fVar89) * fVar89 + fVar89;
  fVar95 = (1.0 - auVar162._8_4_ * fVar95) * fVar95 + fVar95;
  fVar114 = (1.0 - auVar162._12_4_ * fVar114) * fVar114 + fVar114;
  auVar65 = rcpps(auVar65,auVar180);
  fVar54 = auVar65._0_4_;
  fVar91 = auVar65._4_4_;
  fVar109 = auVar65._8_4_;
  fVar120 = auVar65._12_4_;
  fVar54 = (1.0 - auVar180._0_4_ * fVar54) * fVar54 + fVar54;
  fVar91 = (1.0 - auVar180._4_4_ * fVar91) * fVar91 + fVar91;
  fVar109 = (1.0 - auVar180._8_4_ * fVar109) * fVar109 + fVar109;
  fVar120 = (1.0 - auVar180._12_4_ * fVar120) * fVar120 + fVar120;
  uVar43 = *(ulong *)(prim + uVar41 * 7 + 6);
  uVar87 = (undefined2)(uVar43 >> 0x30);
  auVar68._8_4_ = 0;
  auVar68._0_8_ = uVar43;
  auVar68._12_2_ = uVar87;
  auVar68._14_2_ = uVar87;
  uVar87 = (undefined2)(uVar43 >> 0x20);
  auVar67._12_4_ = auVar68._12_4_;
  auVar67._8_2_ = 0;
  auVar67._0_8_ = uVar43;
  auVar67._10_2_ = uVar87;
  auVar66._10_6_ = auVar67._10_6_;
  auVar66._8_2_ = uVar87;
  auVar66._0_8_ = uVar43;
  uVar87 = (undefined2)(uVar43 >> 0x10);
  auVar25._4_8_ = auVar66._8_8_;
  auVar25._2_2_ = uVar87;
  auVar25._0_2_ = uVar87;
  auVar144._0_8_ =
       CONCAT44(((float)(auVar25._0_4_ >> 0x10) - fVar154) * fVar88,
                ((float)(int)(short)uVar43 - fVar142) * fVar121);
  auVar144._8_4_ = ((float)(auVar66._8_4_ >> 0x10) - fVar155) * fVar92;
  auVar144._12_4_ = ((float)(auVar67._12_4_ >> 0x10) - fVar177) * fVar111;
  uVar43 = *(ulong *)(prim + uVar41 * 9 + 6);
  uVar87 = (undefined2)(uVar43 >> 0x30);
  auVar71._8_4_ = 0;
  auVar71._0_8_ = uVar43;
  auVar71._12_2_ = uVar87;
  auVar71._14_2_ = uVar87;
  uVar87 = (undefined2)(uVar43 >> 0x20);
  auVar70._12_4_ = auVar71._12_4_;
  auVar70._8_2_ = 0;
  auVar70._0_8_ = uVar43;
  auVar70._10_2_ = uVar87;
  auVar69._10_6_ = auVar70._10_6_;
  auVar69._8_2_ = uVar87;
  auVar69._0_8_ = uVar43;
  uVar87 = (undefined2)(uVar43 >> 0x10);
  auVar26._4_8_ = auVar69._8_8_;
  auVar26._2_2_ = uVar87;
  auVar26._0_2_ = uVar87;
  auVar181._0_4_ = ((float)(int)(short)uVar43 - fVar142) * fVar121;
  auVar181._4_4_ = ((float)(auVar26._0_4_ >> 0x10) - fVar154) * fVar88;
  auVar181._8_4_ = ((float)(auVar69._8_4_ >> 0x10) - fVar155) * fVar92;
  auVar181._12_4_ = ((float)(auVar70._12_4_ >> 0x10) - fVar177) * fVar111;
  uVar43 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  uVar42 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar41 * -2 + 6);
  uVar87 = (undefined2)(uVar42 >> 0x30);
  auVar99._8_4_ = 0;
  auVar99._0_8_ = uVar42;
  auVar99._12_2_ = uVar87;
  auVar99._14_2_ = uVar87;
  uVar87 = (undefined2)(uVar42 >> 0x20);
  auVar98._12_4_ = auVar99._12_4_;
  auVar98._8_2_ = 0;
  auVar98._0_8_ = uVar42;
  auVar98._10_2_ = uVar87;
  auVar97._10_6_ = auVar98._10_6_;
  auVar97._8_2_ = uVar87;
  auVar97._0_8_ = uVar42;
  uVar87 = (undefined2)(uVar42 >> 0x10);
  auVar27._4_8_ = auVar97._8_8_;
  auVar27._2_2_ = uVar87;
  auVar27._0_2_ = uVar87;
  auVar100._0_8_ =
       CONCAT44(((float)(auVar27._0_4_ >> 0x10) - fVar186) * fVar89,
                ((float)(int)(short)uVar42 - fVar184) * fVar53);
  auVar100._8_4_ = ((float)(auVar97._8_4_ >> 0x10) - fVar222) * fVar95;
  auVar100._12_4_ = ((float)(auVar98._12_4_ >> 0x10) - fVar225) * fVar114;
  uVar87 = (undefined2)(uVar43 >> 0x30);
  auVar74._8_4_ = 0;
  auVar74._0_8_ = uVar43;
  auVar74._12_2_ = uVar87;
  auVar74._14_2_ = uVar87;
  uVar87 = (undefined2)(uVar43 >> 0x20);
  auVar73._12_4_ = auVar74._12_4_;
  auVar73._8_2_ = 0;
  auVar73._0_8_ = uVar43;
  auVar73._10_2_ = uVar87;
  auVar72._10_6_ = auVar73._10_6_;
  auVar72._8_2_ = uVar87;
  auVar72._0_8_ = uVar43;
  uVar87 = (undefined2)(uVar43 >> 0x10);
  auVar28._4_8_ = auVar72._8_8_;
  auVar28._2_2_ = uVar87;
  auVar28._0_2_ = uVar87;
  auVar216._0_4_ = ((float)(int)(short)uVar43 - fVar184) * fVar53;
  auVar216._4_4_ = ((float)(auVar28._0_4_ >> 0x10) - fVar186) * fVar89;
  auVar216._8_4_ = ((float)(auVar72._8_4_ >> 0x10) - fVar222) * fVar95;
  auVar216._12_4_ = ((float)(auVar73._12_4_ >> 0x10) - fVar225) * fVar114;
  uVar43 = *(ulong *)(prim + uVar38 + uVar41 + 6);
  uVar87 = (undefined2)(uVar43 >> 0x30);
  auVar77._8_4_ = 0;
  auVar77._0_8_ = uVar43;
  auVar77._12_2_ = uVar87;
  auVar77._14_2_ = uVar87;
  uVar87 = (undefined2)(uVar43 >> 0x20);
  auVar76._12_4_ = auVar77._12_4_;
  auVar76._8_2_ = 0;
  auVar76._0_8_ = uVar43;
  auVar76._10_2_ = uVar87;
  auVar75._10_6_ = auVar76._10_6_;
  auVar75._8_2_ = uVar87;
  auVar75._0_8_ = uVar43;
  uVar87 = (undefined2)(uVar43 >> 0x10);
  auVar29._4_8_ = auVar75._8_8_;
  auVar29._2_2_ = uVar87;
  auVar29._0_2_ = uVar87;
  auVar78._0_8_ =
       CONCAT44(((float)(auVar29._0_4_ >> 0x10) - fVar171) * fVar91,
                ((float)(int)(short)uVar43 - fVar156) * fVar54);
  auVar78._8_4_ = ((float)(auVar75._8_4_ >> 0x10) - fVar173) * fVar109;
  auVar78._12_4_ = ((float)(auVar76._12_4_ >> 0x10) - fVar122) * fVar120;
  uVar43 = *(ulong *)(prim + uVar41 * 0x17 + 6);
  uVar87 = (undefined2)(uVar43 >> 0x30);
  auVar205._8_4_ = 0;
  auVar205._0_8_ = uVar43;
  auVar205._12_2_ = uVar87;
  auVar205._14_2_ = uVar87;
  uVar87 = (undefined2)(uVar43 >> 0x20);
  auVar204._12_4_ = auVar205._12_4_;
  auVar204._8_2_ = 0;
  auVar204._0_8_ = uVar43;
  auVar204._10_2_ = uVar87;
  auVar203._10_6_ = auVar204._10_6_;
  auVar203._8_2_ = uVar87;
  auVar203._0_8_ = uVar43;
  uVar87 = (undefined2)(uVar43 >> 0x10);
  auVar30._4_8_ = auVar203._8_8_;
  auVar30._2_2_ = uVar87;
  auVar30._0_2_ = uVar87;
  auVar206._0_4_ = ((float)(int)(short)uVar43 - fVar156) * fVar54;
  auVar206._4_4_ = ((float)(auVar30._0_4_ >> 0x10) - fVar171) * fVar91;
  auVar206._8_4_ = ((float)(auVar203._8_4_ >> 0x10) - fVar173) * fVar109;
  auVar206._12_4_ = ((float)(auVar204._12_4_ >> 0x10) - fVar122) * fVar120;
  auVar163._8_4_ = auVar144._8_4_;
  auVar163._0_8_ = auVar144._0_8_;
  auVar163._12_4_ = auVar144._12_4_;
  auVar164 = minps(auVar163,auVar181);
  auVar115._8_4_ = auVar100._8_4_;
  auVar115._0_8_ = auVar100._0_8_;
  auVar115._12_4_ = auVar100._12_4_;
  auVar65 = minps(auVar115,auVar216);
  auVar164 = maxps(auVar164,auVar65);
  auVar116._8_4_ = auVar78._8_4_;
  auVar116._0_8_ = auVar78._0_8_;
  auVar116._12_4_ = auVar78._12_4_;
  auVar65 = minps(auVar116,auVar206);
  auVar124._4_4_ = uVar6;
  auVar124._0_4_ = uVar6;
  auVar124._8_4_ = uVar6;
  auVar124._12_4_ = uVar6;
  auVar65 = maxps(auVar65,auVar124);
  auVar165 = maxps(auVar164,auVar65);
  auVar164 = maxps(auVar144,auVar181);
  auVar65 = maxps(auVar100,auVar216);
  auVar164 = minps(auVar164,auVar65);
  auVar65 = maxps(auVar78,auVar206);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar101._4_4_ = uVar6;
  auVar101._0_4_ = uVar6;
  auVar101._8_4_ = uVar6;
  auVar101._12_4_ = uVar6;
  auVar65 = minps(auVar65,auVar101);
  local_48 = auVar165._0_4_ * 0.99999964;
  fStack_44 = auVar165._4_4_ * 0.99999964;
  fStack_40 = auVar165._8_4_ * 0.99999964;
  fStack_3c = auVar165._12_4_ * 0.99999964;
  auVar65 = minps(auVar164,auVar65);
  auVar79._0_4_ = -(uint)(local_48 <= auVar65._0_4_ * 1.0000004 && PVar5 != (Primitive)0x0);
  auVar79._4_4_ = -(uint)(fStack_44 <= auVar65._4_4_ * 1.0000004 && 1 < (byte)PVar5);
  auVar79._8_4_ = -(uint)(fStack_40 <= auVar65._8_4_ * 1.0000004 && 2 < (byte)PVar5);
  auVar79._12_4_ = -(uint)(fStack_3c <= auVar65._12_4_ * 1.0000004 && 3 < (byte)PVar5);
  uVar46 = movmskps((uint)(byte)PVar5,auVar79);
  local_4e9 = uVar46 != 0;
  if (local_4e9) {
    uVar46 = uVar46 & 0xff;
    local_230 = pre->ray_space + k;
    local_388 = mm_lookupmask_ps._0_8_;
    uStack_380 = mm_lookupmask_ps._8_8_;
    local_320 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    do {
      uVar43 = (ulong)uVar46;
      lVar10 = 0;
      if (uVar43 != 0) {
        for (; (uVar46 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
        }
      }
      uVar43 = uVar43 - 1 & uVar43;
      uVar46 = *(uint *)(prim + 2);
      local_390 = (ulong)uVar46;
      uVar47 = *(uint *)(prim + lVar10 * 4 + 6);
      local_2d8 = (ulong)uVar47;
      pGVar8 = (context->scene->geometries).items[local_390].ptr;
      _Var9 = pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      uVar42 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 + _Var9 * local_2d8);
      pGVar39 = (Geometry *)pGVar8[1].intersectionFilterN;
      lVar10 = *(long *)&pGVar8[1].time_range.upper;
      pfVar1 = (float *)(lVar10 + (long)pGVar39 * uVar42);
      fVar121 = *pfVar1;
      fVar53 = pfVar1[1];
      fVar54 = pfVar1[2];
      fVar88 = pfVar1[3];
      pfVar1 = (float *)(lVar10 + (uVar42 + 1) * (long)pGVar39);
      fVar89 = *pfVar1;
      fVar91 = pfVar1[1];
      fStack_250 = pfVar1[2];
      fStack_24c = pfVar1[3];
      uVar11 = *(undefined8 *)(pfVar1 + 2);
      pfVar1 = (float *)(lVar10 + (uVar42 + 2) * (long)pGVar39);
      local_368 = *pfVar1;
      fStack_364 = pfVar1[1];
      fStack_360 = pfVar1[2];
      fStack_35c = pfVar1[3];
      lVar40 = 0;
      if (uVar43 != 0) {
        for (; (uVar43 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
        }
      }
      pfVar2 = (float *)(lVar10 + (uVar42 + 3) * (long)pGVar39);
      local_378 = *pfVar2;
      fStack_374 = pfVar2[1];
      fStack_370 = pfVar2[2];
      fStack_36c = pfVar2[3];
      if ((uVar43 != 0) && (uVar42 = uVar43 - 1 & uVar43, uVar42 != 0)) {
        lVar10 = 0;
        if (uVar42 != 0) {
          for (; (uVar42 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
          }
        }
        pGVar39 = (Geometry *)
                  ((long)pGVar39 *
                  (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                                  _Var9 * *(uint *)(prim + lVar10 * 4 + 6)));
      }
      iVar7 = (int)pGVar8[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar92 = *(float *)(ray + k * 4);
      fVar95 = *(float *)(ray + k * 4 + 0x10);
      fVar109 = *(float *)(ray + k * 4 + 0x20);
      fVar173 = fVar121 - fVar92;
      fVar122 = fVar53 - fVar95;
      fVar131 = fVar54 - fVar109;
      fVar111 = (local_230->vx).field_0.m128[0];
      fVar114 = (local_230->vx).field_0.m128[1];
      fVar120 = (local_230->vx).field_0.m128[2];
      fVar142 = (local_230->vy).field_0.m128[0];
      fVar154 = (local_230->vy).field_0.m128[1];
      fVar155 = (local_230->vy).field_0.m128[2];
      fVar177 = (local_230->vz).field_0.m128[0];
      fVar156 = (local_230->vz).field_0.m128[1];
      fVar171 = (local_230->vz).field_0.m128[2];
      local_2b8 = fVar173 * fVar111 + fVar122 * fVar142 + fVar131 * fVar177;
      local_248 = fVar173 * fVar114 + fVar122 * fVar154 + fVar131 * fVar156;
      fVar135 = fVar173 * fVar120 + fVar122 * fVar155 + fVar131 * fVar171;
      fVar173 = fVar89 - fVar92;
      fVar122 = fVar91 - fVar95;
      fVar131 = fStack_250 - fVar109;
      local_268 = fVar173 * fVar111 + fVar122 * fVar142 + fVar131 * fVar177;
      local_2c8 = fVar173 * fVar114 + fVar122 * fVar154 + fVar131 * fVar156;
      fVar184 = fVar173 * fVar120 + fVar122 * fVar155 + fVar131 * fVar171;
      fVar173 = local_368 - fVar92;
      fVar122 = fStack_364 - fVar95;
      fVar131 = fStack_360 - fVar109;
      local_338 = fVar173 * fVar111 + fVar122 * fVar142 + fVar131 * fVar177;
      fVar186 = fVar173 * fVar114 + fVar122 * fVar154 + fVar131 * fVar156;
      local_2a8 = fVar173 * fVar120 + fVar122 * fVar155 + fVar131 * fVar171;
      fVar92 = local_378 - fVar92;
      fVar95 = fStack_374 - fVar95;
      fVar109 = fStack_370 - fVar109;
      fVar111 = fVar92 * fVar111 + fVar95 * fVar142 + fVar109 * fVar177;
      fVar114 = fVar92 * fVar114 + fVar95 * fVar154 + fVar109 * fVar156;
      fVar95 = fVar92 * fVar120 + fVar95 * fVar155 + fVar109 * fVar171;
      auVar262._0_8_ = CONCAT44(local_248,local_2b8) & 0x7fffffff7fffffff;
      auVar262._8_4_ = ABS(fVar135);
      auVar262._12_4_ = ABS(fVar88);
      auVar145._0_8_ = CONCAT44(local_2c8,local_268) & 0x7fffffff7fffffff;
      auVar145._8_4_ = ABS(fVar184);
      auVar145._12_4_ = ABS(fStack_24c);
      auVar164 = maxps(auVar262,auVar145);
      auVar166._0_8_ = CONCAT44(fVar186,local_338) & 0x7fffffff7fffffff;
      auVar166._8_4_ = ABS(local_2a8);
      auVar166._12_4_ = ABS(fStack_35c);
      auVar102._0_8_ = CONCAT44(fVar114,fVar111) & 0x7fffffff7fffffff;
      auVar102._8_4_ = ABS(fVar95);
      auVar102._12_4_ = ABS(fStack_36c);
      auVar65 = maxps(auVar166,auVar102);
      auVar65 = maxps(auVar164,auVar65);
      fVar92 = auVar65._4_4_;
      if (auVar65._4_4_ <= auVar65._0_4_) {
        fVar92 = auVar65._0_4_;
      }
      auVar263._8_8_ = auVar65._8_8_;
      auVar263._0_8_ = auVar65._8_8_;
      fVar109 = (float)iVar7;
      local_2e8 = ZEXT416((uint)fVar109);
      if (auVar65._8_4_ <= fVar92) {
        auVar263._0_4_ = fVar92;
      }
      lVar10 = (long)iVar7 * 0x44;
      fVar92 = *(float *)*(undefined1 (*) [12])(bspline_basis0 + lVar10 + 0x908);
      fVar120 = *(float *)(bspline_basis0 + lVar10 + 0x90c);
      fVar142 = *(float *)(bspline_basis0 + lVar10 + 0x910);
      auVar16 = *(undefined1 (*) [12])(bspline_basis0 + lVar10 + 0x908);
      fVar154 = *(float *)(bspline_basis0 + lVar10 + 0x914);
      fVar155 = *(float *)(bspline_basis0 + lVar10 + 0xd8c);
      fVar177 = *(float *)(bspline_basis0 + lVar10 + 0xd90);
      fVar156 = *(float *)(bspline_basis0 + lVar10 + 0xd94);
      fVar171 = *(float *)(bspline_basis0 + lVar10 + 0xd98);
      fVar173 = *(float *)(bspline_basis0 + lVar10 + 0x484);
      fVar122 = *(float *)(bspline_basis0 + lVar10 + 0x488);
      fVar131 = *(float *)(bspline_basis0 + lVar10 + 0x48c);
      fVar190 = *(float *)(bspline_basis0 + lVar10 + 0x490);
      local_278 = *(float *)(bspline_basis0 + lVar10);
      fStack_274 = *(float *)(bspline_basis0 + lVar10 + 4);
      fStack_270 = *(float *)(bspline_basis0 + lVar10 + 8);
      fStack_26c = *(float *)(bspline_basis0 + lVar10 + 0xc);
      fVar191 = local_2b8 * local_278 + local_268 * fVar173 + local_338 * fVar92 + fVar111 * fVar155
      ;
      fVar208 = local_2b8 * fStack_274 +
                local_268 * fVar122 + local_338 * fVar120 + fVar111 * fVar177;
      fVar211 = local_2b8 * fStack_270 +
                local_268 * fVar131 + local_338 * fVar142 + fVar111 * fVar156;
      fVar213 = local_2b8 * fStack_26c +
                local_268 * fVar190 + local_338 * fVar154 + fVar111 * fVar171;
      fVar259 = local_248 * local_278 + local_2c8 * fVar173 + fVar186 * fVar92 + fVar114 * fVar155;
      fVar132 = local_248 * fStack_274 + local_2c8 * fVar122 + fVar186 * fVar120 + fVar114 * fVar177
      ;
      fVar136 = local_248 * fStack_270 + local_2c8 * fVar131 + fVar186 * fVar142 + fVar114 * fVar156
      ;
      fVar139 = local_248 * fStack_26c + local_2c8 * fVar190 + fVar186 * fVar154 + fVar114 * fVar171
      ;
      fVar157 = fVar88 * local_278 +
                fStack_24c * fVar173 + fStack_35c * fVar92 + fStack_36c * fVar155;
      fVar172 = fVar88 * fStack_274 +
                fStack_24c * fVar122 + fStack_35c * fVar120 + fStack_36c * fVar177;
      auVar217._4_4_ = fVar172;
      auVar217._0_4_ = fVar157;
      fVar174 = fVar88 * fStack_270 +
                fStack_24c * fVar131 + fStack_35c * fVar142 + fStack_36c * fVar156;
      fVar176 = fVar88 * fStack_26c +
                fStack_24c * fVar190 + fStack_35c * fVar154 + fStack_36c * fVar171;
      fVar120 = *(float *)(bspline_basis1 + lVar10 + 0xd8c);
      fVar142 = *(float *)(bspline_basis1 + lVar10 + 0xd90);
      fVar207 = *(float *)(bspline_basis1 + lVar10 + 0xd94);
      fVar210 = *(float *)(bspline_basis1 + lVar10 + 0xd98);
      fVar215 = *(float *)(bspline_basis1 + lVar10 + 0x908);
      fVar220 = *(float *)(bspline_basis1 + lVar10 + 0x90c);
      fVar221 = *(float *)(bspline_basis1 + lVar10 + 0x910);
      fVar222 = *(float *)(bspline_basis1 + lVar10 + 0x914);
      local_58 = fStack_36c;
      fStack_54 = fStack_36c;
      fStack_50 = fStack_36c;
      fStack_4c = fStack_36c;
      local_128 = fStack_35c;
      fStack_124 = fStack_35c;
      fStack_120 = fStack_35c;
      fStack_11c = fStack_35c;
      fVar225 = *(float *)(bspline_basis1 + lVar10 + 0x484);
      fVar226 = *(float *)(bspline_basis1 + lVar10 + 0x488);
      fVar227 = *(float *)(bspline_basis1 + lVar10 + 0x48c);
      fVar228 = *(float *)(bspline_basis1 + lVar10 + 0x490);
      local_138 = fStack_24c;
      fStack_134 = fStack_24c;
      fStack_130 = fStack_24c;
      fStack_12c = fStack_24c;
      fVar229 = *(float *)(bspline_basis1 + lVar10);
      fVar230 = *(float *)(bspline_basis1 + lVar10 + 4);
      fVar238 = *(float *)(bspline_basis1 + lVar10 + 8);
      fVar241 = *(float *)(bspline_basis1 + lVar10 + 0xc);
      fVar248 = local_2b8 * fVar229 + local_268 * fVar225 + local_338 * fVar215 + fVar111 * fVar120;
      fVar254 = local_2b8 * fVar230 + local_268 * fVar226 + local_338 * fVar220 + fVar111 * fVar142;
      fVar257 = local_2b8 * fVar238 + local_268 * fVar227 + local_338 * fVar221 + fVar111 * fVar207;
      fVar260 = local_2b8 * fVar241 + local_268 * fVar228 + local_338 * fVar222 + fVar111 * fVar210;
      fVar178 = local_248 * fVar229 + local_2c8 * fVar225 + fVar186 * fVar215 + fVar114 * fVar120;
      fVar185 = local_248 * fVar230 + local_2c8 * fVar226 + fVar186 * fVar220 + fVar114 * fVar142;
      fVar187 = local_248 * fVar238 + local_2c8 * fVar227 + fVar186 * fVar221 + fVar114 * fVar207;
      fVar189 = local_248 * fVar241 + local_2c8 * fVar228 + fVar186 * fVar222 + fVar114 * fVar210;
      local_148 = fVar88;
      fStack_144 = fVar88;
      fStack_140 = fVar88;
      fStack_13c = fVar88;
      auVar223._0_4_ =
           fVar88 * fVar229 + fStack_24c * fVar225 + fStack_35c * fVar215 + fStack_36c * fVar120;
      auVar223._4_4_ =
           fVar88 * fVar230 + fStack_24c * fVar226 + fStack_35c * fVar220 + fStack_36c * fVar142;
      auVar223._8_4_ =
           fVar88 * fVar238 + fStack_24c * fVar227 + fStack_35c * fVar221 + fStack_36c * fVar207;
      auVar223._12_4_ =
           fVar88 * fVar241 + fStack_24c * fVar228 + fStack_35c * fVar222 + fStack_36c * fVar210;
      fVar249 = fVar248 - fVar191;
      fVar255 = fVar254 - fVar208;
      fVar258 = fVar257 - fVar211;
      fVar261 = fVar260 - fVar213;
      fVar244 = fVar178 - fVar259;
      fVar247 = fVar185 - fVar132;
      fVar253 = fVar187 - fVar136;
      fVar256 = fVar189 - fVar139;
      fVar92 = fVar259 * fVar249 - fVar191 * fVar244;
      fVar133 = fVar132 * fVar255 - fVar208 * fVar247;
      fVar137 = fVar136 * fVar258 - fVar211 * fVar253;
      fVar140 = fVar139 * fVar261 - fVar213 * fVar256;
      auVar217._8_4_ = fVar174;
      auVar217._12_4_ = fVar176;
      auVar65 = maxps(auVar217,auVar223);
      bVar31 = fVar92 * fVar92 <=
               auVar65._0_4_ * auVar65._0_4_ * (fVar249 * fVar249 + fVar244 * fVar244) &&
               0.0 < fVar109;
      auVar125._0_4_ = -(uint)bVar31;
      bVar32 = fVar133 * fVar133 <=
               auVar65._4_4_ * auVar65._4_4_ * (fVar255 * fVar255 + fVar247 * fVar247) &&
               1.0 < fVar109;
      auVar125._4_4_ = -(uint)bVar32;
      bVar45 = fVar137 * fVar137 <=
               auVar65._8_4_ * auVar65._8_4_ * (fVar258 * fVar258 + fVar253 * fVar253) &&
               2.0 < fVar109;
      auVar125._8_4_ = -(uint)bVar45;
      bVar44 = 3.0 < fVar109 &&
               fVar140 * fVar140 <=
               auVar65._12_4_ * auVar65._12_4_ * (fVar261 * fVar261 + fVar256 * fVar256);
      auVar125._12_4_ = -(uint)bVar44;
      local_348 = auVar263._0_4_;
      fStack_344 = auVar263._4_4_;
      fStack_340 = auVar263._8_4_;
      fStack_33c = auVar263._12_4_;
      local_348 = local_348 * 4.7683716e-07;
      iVar34 = movmskps(iVar7,auVar125);
      fVar92 = *(float *)(ray + k * 4 + 0x30);
      _local_358 = ZEXT416((uint)fVar92);
      fStack_334 = local_338;
      fStack_330 = local_338;
      fStack_32c = local_338;
      fStack_2c4 = local_2c8;
      fStack_2c0 = local_2c8;
      fStack_2bc = local_2c8;
      fStack_2b4 = local_2b8;
      fStack_2b0 = local_2b8;
      fStack_2ac = local_2b8;
      fStack_2a4 = local_2a8;
      fStack_2a0 = local_2a8;
      fStack_29c = local_2a8;
      fStack_264 = local_268;
      fStack_260 = local_268;
      fStack_25c = local_268;
      local_258 = fVar89;
      fStack_254 = fVar91;
      fStack_244 = local_248;
      fStack_240 = local_248;
      fStack_23c = local_248;
      if (iVar34 == 0) {
LAB_00b9f142:
        uVar48 = 0;
LAB_00b9f14b:
        bVar44 = false;
        local_2d8._0_4_ = uVar47;
        local_358._0_4_ = fVar92;
        local_2e8._0_4_ = fVar109;
      }
      else {
        fVar55 = fVar120 * fVar95 + fVar215 * local_2a8 + fVar225 * fVar184 + fVar229 * fVar135;
        fVar90 = fVar142 * fVar95 + fVar220 * local_2a8 + fVar226 * fVar184 + fVar230 * fVar135;
        fVar93 = fVar207 * fVar95 + fVar221 * local_2a8 + fVar227 * fVar184 + fVar238 * fVar135;
        fVar94 = fVar210 * fVar95 + fVar222 * local_2a8 + fVar228 * fVar184 + fVar241 * fVar135;
        local_498._0_4_ = auVar16._0_4_;
        local_498._4_4_ = auVar16._4_4_;
        uStack_490._0_4_ = auVar16._8_4_;
        fVar123 = fVar155 * fVar95 + (float)local_498 * local_2a8 + fVar173 * fVar184 +
                  local_278 * fVar135;
        fVar134 = fVar177 * fVar95 + local_498._4_4_ * local_2a8 + fVar122 * fVar184 +
                  fStack_274 * fVar135;
        fVar138 = fVar156 * fVar95 + (float)uStack_490 * local_2a8 + fVar131 * fVar184 +
                  fStack_270 * fVar135;
        fVar141 = fVar171 * fVar95 + fVar154 * local_2a8 + fVar190 * fVar184 + fStack_26c * fVar135;
        fVar120 = *(float *)(bspline_basis0 + lVar10 + 0x1210);
        fVar142 = *(float *)(bspline_basis0 + lVar10 + 0x1214);
        fVar154 = *(float *)(bspline_basis0 + lVar10 + 0x1218);
        fVar155 = *(float *)(bspline_basis0 + lVar10 + 0x121c);
        fVar177 = *(float *)(bspline_basis0 + lVar10 + 0x1694);
        fVar156 = *(float *)(bspline_basis0 + lVar10 + 0x1698);
        fVar171 = *(float *)(bspline_basis0 + lVar10 + 0x169c);
        fVar173 = *(float *)(bspline_basis0 + lVar10 + 0x16a0);
        fVar122 = *(float *)(bspline_basis0 + lVar10 + 0x1b18);
        fVar131 = *(float *)(bspline_basis0 + lVar10 + 0x1b1c);
        fVar190 = *(float *)(bspline_basis0 + lVar10 + 0x1b20);
        fVar207 = *(float *)(bspline_basis0 + lVar10 + 0x1b24);
        fVar210 = *(float *)(bspline_basis0 + lVar10 + 0x1f9c);
        fVar215 = *(float *)(bspline_basis0 + lVar10 + 0x1fa0);
        fVar220 = *(float *)(bspline_basis0 + lVar10 + 0x1fa4);
        fVar221 = *(float *)(bspline_basis0 + lVar10 + 0x1fa8);
        fVar231 = local_2b8 * fVar120 +
                  local_268 * fVar177 + local_338 * fVar122 + fVar111 * fVar210;
        fVar239 = local_2b8 * fVar142 +
                  local_268 * fVar156 + local_338 * fVar131 + fVar111 * fVar215;
        fVar242 = local_2b8 * fVar154 +
                  local_268 * fVar171 + local_338 * fVar190 + fVar111 * fVar220;
        fVar245 = local_2b8 * fVar155 +
                  local_268 * fVar173 + local_338 * fVar207 + fVar111 * fVar221;
        fVar272 = local_248 * fVar120 + local_2c8 * fVar177 + fVar186 * fVar122 + fVar114 * fVar210;
        fVar274 = local_248 * fVar142 + local_2c8 * fVar156 + fVar186 * fVar131 + fVar114 * fVar215;
        fVar276 = local_248 * fVar154 + local_2c8 * fVar171 + fVar186 * fVar190 + fVar114 * fVar220;
        fVar278 = local_248 * fVar155 + local_2c8 * fVar173 + fVar186 * fVar207 + fVar114 * fVar221;
        fVar222 = *(float *)(bspline_basis1 + lVar10 + 0x1210);
        fVar225 = *(float *)(bspline_basis1 + lVar10 + 0x1214);
        fVar226 = *(float *)(bspline_basis1 + lVar10 + 0x1218);
        fVar227 = *(float *)(bspline_basis1 + lVar10 + 0x121c);
        fVar228 = *(float *)(bspline_basis1 + lVar10 + 0x1b18);
        fVar229 = *(float *)(bspline_basis1 + lVar10 + 0x1b1c);
        fVar230 = *(float *)(bspline_basis1 + lVar10 + 0x1b20);
        fVar238 = *(float *)(bspline_basis1 + lVar10 + 0x1b24);
        fVar241 = *(float *)(bspline_basis1 + lVar10 + 0x1f9c);
        fVar133 = *(float *)(bspline_basis1 + lVar10 + 0x1fa0);
        fVar137 = *(float *)(bspline_basis1 + lVar10 + 0x1fa4);
        fVar140 = *(float *)(bspline_basis1 + lVar10 + 0x1fa8);
        fVar232 = *(float *)(bspline_basis1 + lVar10 + 0x1694);
        fVar240 = *(float *)(bspline_basis1 + lVar10 + 0x1698);
        fVar243 = *(float *)(bspline_basis1 + lVar10 + 0x169c);
        fVar246 = *(float *)(bspline_basis1 + lVar10 + 0x16a0);
        fVar192 = local_2b8 * fVar222 +
                  local_268 * fVar232 + local_338 * fVar228 + fVar111 * fVar241;
        fVar209 = local_2b8 * fVar225 +
                  local_268 * fVar240 + local_338 * fVar229 + fVar111 * fVar133;
        fVar212 = local_2b8 * fVar226 +
                  local_268 * fVar243 + local_338 * fVar230 + fVar111 * fVar137;
        fVar214 = local_2b8 * fVar227 +
                  local_268 * fVar246 + local_338 * fVar238 + fVar111 * fVar140;
        fVar96 = local_248 * fVar222 + local_2c8 * fVar232 + fVar186 * fVar228 + fVar114 * fVar241;
        fVar110 = local_248 * fVar225 + local_2c8 * fVar240 + fVar186 * fVar229 + fVar114 * fVar133;
        fVar112 = local_248 * fVar226 + local_2c8 * fVar243 + fVar186 * fVar230 + fVar114 * fVar137;
        fVar113 = local_248 * fVar227 + local_2c8 * fVar246 + fVar186 * fVar238 + fVar114 * fVar140;
        auVar251._0_8_ = CONCAT44(fVar239,fVar231) & 0x7fffffff7fffffff;
        auVar251._8_4_ = ABS(fVar242);
        auVar251._12_4_ = ABS(fVar245);
        auVar218._0_8_ = CONCAT44(fVar274,fVar272) & 0x7fffffff7fffffff;
        auVar218._8_4_ = ABS(fVar276);
        auVar218._12_4_ = ABS(fVar278);
        auVar65 = maxps(auVar251,auVar218);
        auVar264._0_8_ =
             CONCAT44(fVar142 * fVar135 + fVar156 * fVar184 + fVar131 * local_2a8 + fVar215 * fVar95
                      ,fVar120 * fVar135 +
                       fVar177 * fVar184 + fVar122 * local_2a8 + fVar210 * fVar95) &
             0x7fffffff7fffffff;
        auVar264._8_4_ =
             ABS(fVar154 * fVar135 + fVar171 * fVar184 + fVar190 * local_2a8 + fVar220 * fVar95);
        auVar264._12_4_ =
             ABS(fVar155 * fVar135 + fVar173 * fVar184 + fVar207 * local_2a8 + fVar221 * fVar95);
        auVar65 = maxps(auVar65,auVar264);
        uVar48 = -(uint)(local_348 <= auVar65._0_4_);
        uVar50 = -(uint)(local_348 <= auVar65._4_4_);
        uVar49 = -(uint)(local_348 <= auVar65._8_4_);
        uVar51 = -(uint)(local_348 <= auVar65._12_4_);
        fVar156 = (float)((uint)fVar231 & uVar48 | ~uVar48 & (uint)fVar249);
        fVar173 = (float)((uint)fVar239 & uVar50 | ~uVar50 & (uint)fVar255);
        fVar207 = (float)((uint)fVar242 & uVar49 | ~uVar49 & (uint)fVar258);
        fVar215 = (float)((uint)fVar245 & uVar51 | ~uVar51 & (uint)fVar261);
        auVar14._4_4_ = fVar247;
        auVar14._0_4_ = fVar244;
        auVar14._8_4_ = fVar253;
        auVar14._12_4_ = fVar256;
        fVar220 = (float)(~uVar48 & (uint)fVar244 | (uint)fVar272 & uVar48);
        fVar221 = (float)(~uVar50 & (uint)fVar247 | (uint)fVar274 & uVar50);
        fVar231 = (float)(~uVar49 & (uint)fVar253 | (uint)fVar276 & uVar49);
        fVar239 = (float)(~uVar51 & (uint)fVar256 | (uint)fVar278 & uVar51);
        auVar265._0_8_ = CONCAT44(fVar209,fVar192) & 0x7fffffff7fffffff;
        auVar265._8_4_ = ABS(fVar212);
        auVar265._12_4_ = ABS(fVar214);
        auVar224._0_8_ = CONCAT44(fVar110,fVar96) & 0x7fffffff7fffffff;
        auVar224._8_4_ = ABS(fVar112);
        auVar224._12_4_ = ABS(fVar113);
        auVar65 = maxps(auVar265,auVar224);
        auVar182._0_8_ =
             CONCAT44(fVar225 * fVar135 + fVar240 * fVar184 + fVar229 * local_2a8 + fVar133 * fVar95
                      ,fVar222 * fVar135 +
                       fVar232 * fVar184 + fVar228 * local_2a8 + fVar241 * fVar95) &
             0x7fffffff7fffffff;
        auVar182._8_4_ =
             ABS(fVar226 * fVar135 + fVar243 * fVar184 + fVar230 * local_2a8 + fVar137 * fVar95);
        auVar182._12_4_ =
             ABS(fVar227 * fVar135 + fVar246 * fVar184 + fVar238 * local_2a8 + fVar140 * fVar95);
        auVar65 = maxps(auVar65,auVar182);
        uVar48 = -(uint)(local_348 <= auVar65._0_4_);
        uVar50 = -(uint)(local_348 <= auVar65._4_4_);
        uVar49 = -(uint)(local_348 <= auVar65._8_4_);
        uVar51 = -(uint)(local_348 <= auVar65._12_4_);
        fVar177 = (float)((uint)fVar192 & uVar48 | ~uVar48 & (uint)fVar249);
        fVar171 = (float)((uint)fVar209 & uVar50 | ~uVar50 & (uint)fVar255);
        fVar122 = (float)((uint)fVar212 & uVar49 | ~uVar49 & (uint)fVar258);
        fVar131 = (float)((uint)fVar214 & uVar51 | ~uVar51 & (uint)fVar261);
        fVar222 = (float)(~uVar48 & (uint)fVar244 | (uint)fVar96 & uVar48);
        fVar225 = (float)(~uVar50 & (uint)fVar247 | (uint)fVar110 & uVar50);
        fVar226 = (float)(~uVar49 & (uint)fVar253 | (uint)fVar112 & uVar49);
        fVar227 = (float)(~uVar51 & (uint)fVar256 | (uint)fVar113 & uVar51);
        auVar103._0_4_ = fVar220 * fVar220 + fVar156 * fVar156;
        auVar103._4_4_ = fVar221 * fVar221 + fVar173 * fVar173;
        auVar103._8_4_ = fVar231 * fVar231 + fVar207 * fVar207;
        auVar103._12_4_ = fVar239 * fVar239 + fVar215 * fVar215;
        auVar65 = rsqrtps(auVar14,auVar103);
        fVar120 = auVar65._0_4_;
        fVar142 = auVar65._4_4_;
        fVar154 = auVar65._8_4_;
        fVar155 = auVar65._12_4_;
        auVar146._0_4_ = fVar120 * fVar120 * auVar103._0_4_ * 0.5 * fVar120;
        auVar146._4_4_ = fVar142 * fVar142 * auVar103._4_4_ * 0.5 * fVar142;
        auVar146._8_4_ = fVar154 * fVar154 * auVar103._8_4_ * 0.5 * fVar154;
        auVar146._12_4_ = fVar155 * fVar155 * auVar103._12_4_ * 0.5 * fVar155;
        fVar228 = fVar120 * 1.5 - auVar146._0_4_;
        fVar229 = fVar142 * 1.5 - auVar146._4_4_;
        fVar230 = fVar154 * 1.5 - auVar146._8_4_;
        fVar238 = fVar155 * 1.5 - auVar146._12_4_;
        auVar104._0_4_ = fVar222 * fVar222 + fVar177 * fVar177;
        auVar104._4_4_ = fVar225 * fVar225 + fVar171 * fVar171;
        auVar104._8_4_ = fVar226 * fVar226 + fVar122 * fVar122;
        auVar104._12_4_ = fVar227 * fVar227 + fVar131 * fVar131;
        auVar65 = rsqrtps(auVar146,auVar104);
        fVar120 = auVar65._0_4_;
        fVar142 = auVar65._4_4_;
        fVar154 = auVar65._8_4_;
        fVar155 = auVar65._12_4_;
        fVar120 = fVar120 * 1.5 - fVar120 * fVar120 * auVar104._0_4_ * 0.5 * fVar120;
        fVar190 = fVar142 * 1.5 - fVar142 * fVar142 * auVar104._4_4_ * 0.5 * fVar142;
        fVar154 = fVar154 * 1.5 - fVar154 * fVar154 * auVar104._8_4_ * 0.5 * fVar154;
        fVar210 = fVar155 * 1.5 - fVar155 * fVar155 * auVar104._12_4_ * 0.5 * fVar155;
        fVar241 = fVar220 * fVar228 * fVar157;
        fVar244 = fVar221 * fVar229 * fVar172;
        fVar247 = fVar231 * fVar230 * fVar174;
        fVar253 = fVar239 * fVar238 * fVar176;
        fVar142 = -fVar156 * fVar228 * fVar157;
        fVar155 = -fVar173 * fVar229 * fVar172;
        fVar156 = -fVar207 * fVar230 * fVar174;
        fVar173 = -fVar215 * fVar238 * fVar176;
        fVar192 = fVar228 * 0.0 * fVar157;
        fVar209 = fVar229 * 0.0 * fVar172;
        fVar212 = fVar230 * 0.0 * fVar174;
        fVar214 = fVar238 * 0.0 * fVar176;
        fVar256 = fVar222 * fVar120 * auVar223._0_4_;
        fVar133 = fVar225 * fVar190 * auVar223._4_4_;
        fVar137 = fVar226 * fVar154 * auVar223._8_4_;
        fVar140 = fVar227 * fVar210 * auVar223._12_4_;
        fVar249 = fVar248 + fVar256;
        fVar255 = fVar254 + fVar133;
        fVar258 = fVar257 + fVar137;
        fVar261 = fVar260 + fVar140;
        fVar225 = -fVar177 * fVar120 * auVar223._0_4_;
        fVar227 = -fVar171 * fVar190 * auVar223._4_4_;
        fVar229 = -fVar122 * fVar154 * auVar223._8_4_;
        fVar238 = -fVar131 * fVar210 * auVar223._12_4_;
        fVar232 = fVar178 + fVar225;
        fVar240 = fVar185 + fVar227;
        fVar243 = fVar187 + fVar229;
        fVar246 = fVar189 + fVar238;
        fVar131 = fVar120 * 0.0 * auVar223._0_4_;
        fVar207 = fVar190 * 0.0 * auVar223._4_4_;
        fVar215 = fVar154 * 0.0 * auVar223._8_4_;
        fVar221 = fVar210 * 0.0 * auVar223._12_4_;
        fVar122 = fVar191 - fVar241;
        fVar190 = fVar208 - fVar244;
        fVar210 = fVar211 - fVar247;
        fVar220 = fVar213 - fVar253;
        fVar96 = fVar55 + fVar131;
        fVar110 = fVar90 + fVar207;
        fVar112 = fVar93 + fVar215;
        fVar113 = fVar94 + fVar221;
        fVar120 = fVar259 - fVar142;
        fVar154 = fVar132 - fVar155;
        fVar177 = fVar136 - fVar156;
        fVar171 = fVar139 - fVar173;
        fVar222 = fVar123 - fVar192;
        fVar226 = fVar134 - fVar209;
        fVar228 = fVar138 - fVar212;
        fVar230 = fVar141 - fVar214;
        uVar48 = -(uint)(0.0 < (fVar120 * (fVar96 - fVar222) - fVar222 * (fVar232 - fVar120)) * 0.0
                               + (fVar222 * (fVar249 - fVar122) - (fVar96 - fVar222) * fVar122) *
                                 0.0 + ((fVar232 - fVar120) * fVar122 -
                                       (fVar249 - fVar122) * fVar120));
        uVar50 = -(uint)(0.0 < (fVar154 * (fVar110 - fVar226) - fVar226 * (fVar240 - fVar154)) * 0.0
                               + (fVar226 * (fVar255 - fVar190) - (fVar110 - fVar226) * fVar190) *
                                 0.0 + ((fVar240 - fVar154) * fVar190 -
                                       (fVar255 - fVar190) * fVar154));
        uVar49 = -(uint)(0.0 < (fVar177 * (fVar112 - fVar228) - fVar228 * (fVar243 - fVar177)) * 0.0
                               + (fVar228 * (fVar258 - fVar210) - (fVar112 - fVar228) * fVar210) *
                                 0.0 + ((fVar243 - fVar177) * fVar210 -
                                       (fVar258 - fVar210) * fVar177));
        uVar51 = -(uint)(0.0 < (fVar171 * (fVar113 - fVar230) - fVar230 * (fVar246 - fVar171)) * 0.0
                               + (fVar230 * (fVar261 - fVar220) - (fVar113 - fVar230) * fVar220) *
                                 0.0 + ((fVar246 - fVar171) * fVar220 -
                                       (fVar261 - fVar220) * fVar171));
        fVar256 = (float)((uint)(fVar248 - fVar256) & uVar48 | ~uVar48 & (uint)(fVar191 + fVar241));
        fVar133 = (float)((uint)(fVar254 - fVar133) & uVar50 | ~uVar50 & (uint)(fVar208 + fVar244));
        fVar137 = (float)((uint)(fVar257 - fVar137) & uVar49 | ~uVar49 & (uint)(fVar211 + fVar247));
        fVar140 = (float)((uint)(fVar260 - fVar140) & uVar51 | ~uVar51 & (uint)(fVar213 + fVar253));
        fVar259 = (float)((uint)(fVar178 - fVar225) & uVar48 | ~uVar48 & (uint)(fVar259 + fVar142));
        fVar132 = (float)((uint)(fVar185 - fVar227) & uVar50 | ~uVar50 & (uint)(fVar132 + fVar155));
        fVar136 = (float)((uint)(fVar187 - fVar229) & uVar49 | ~uVar49 & (uint)(fVar136 + fVar156));
        fVar139 = (float)((uint)(fVar189 - fVar238) & uVar51 | ~uVar51 & (uint)(fVar139 + fVar173));
        fVar241 = (float)((uint)(fVar55 - fVar131) & uVar48 | ~uVar48 & (uint)(fVar123 + fVar192));
        fVar244 = (float)((uint)(fVar90 - fVar207) & uVar50 | ~uVar50 & (uint)(fVar134 + fVar209));
        fVar247 = (float)((uint)(fVar93 - fVar215) & uVar49 | ~uVar49 & (uint)(fVar138 + fVar212));
        fVar253 = (float)((uint)(fVar94 - fVar221) & uVar51 | ~uVar51 & (uint)(fVar141 + fVar214));
        fVar131 = (float)((uint)fVar122 & uVar48 | ~uVar48 & (uint)fVar249);
        fVar207 = (float)((uint)fVar190 & uVar50 | ~uVar50 & (uint)fVar255);
        fVar215 = (float)((uint)fVar210 & uVar49 | ~uVar49 & (uint)fVar258);
        fVar221 = (float)((uint)fVar220 & uVar51 | ~uVar51 & (uint)fVar261);
        fVar142 = (float)((uint)fVar120 & uVar48 | ~uVar48 & (uint)fVar232);
        fVar155 = (float)((uint)fVar154 & uVar50 | ~uVar50 & (uint)fVar240);
        fVar156 = (float)((uint)fVar177 & uVar49 | ~uVar49 & (uint)fVar243);
        fVar173 = (float)((uint)fVar171 & uVar51 | ~uVar51 & (uint)fVar246);
        fVar225 = (float)((uint)fVar222 & uVar48 | ~uVar48 & (uint)fVar96);
        fVar227 = (float)((uint)fVar226 & uVar50 | ~uVar50 & (uint)fVar110);
        fVar229 = (float)((uint)fVar228 & uVar49 | ~uVar49 & (uint)fVar112);
        fVar238 = (float)((uint)fVar230 & uVar51 | ~uVar51 & (uint)fVar113);
        fVar178 = (float)((uint)fVar249 & uVar48 | ~uVar48 & (uint)fVar122) - fVar256;
        fVar185 = (float)((uint)fVar255 & uVar50 | ~uVar50 & (uint)fVar190) - fVar133;
        fVar187 = (float)((uint)fVar258 & uVar49 | ~uVar49 & (uint)fVar210) - fVar137;
        fVar189 = (float)((uint)fVar261 & uVar51 | ~uVar51 & (uint)fVar220) - fVar140;
        fVar191 = (float)((uint)fVar232 & uVar48 | ~uVar48 & (uint)fVar120) - fVar259;
        fVar208 = (float)((uint)fVar240 & uVar50 | ~uVar50 & (uint)fVar154) - fVar132;
        fVar211 = (float)((uint)fVar243 & uVar49 | ~uVar49 & (uint)fVar177) - fVar136;
        fVar213 = (float)((uint)fVar246 & uVar51 | ~uVar51 & (uint)fVar171) - fVar139;
        fVar222 = (float)((uint)fVar96 & uVar48 | ~uVar48 & (uint)fVar222) - fVar241;
        fVar226 = (float)((uint)fVar110 & uVar50 | ~uVar50 & (uint)fVar226) - fVar244;
        fVar228 = (float)((uint)fVar112 & uVar49 | ~uVar49 & (uint)fVar228) - fVar247;
        fVar230 = (float)((uint)fVar113 & uVar51 | ~uVar51 & (uint)fVar230) - fVar253;
        fVar257 = fVar256 - fVar131;
        fVar258 = fVar133 - fVar207;
        fVar260 = fVar137 - fVar215;
        fVar261 = fVar140 - fVar221;
        fVar122 = fVar259 - fVar142;
        fVar190 = fVar132 - fVar155;
        fVar210 = fVar136 - fVar156;
        fVar220 = fVar139 - fVar173;
        fVar120 = fVar241 - fVar225;
        fVar154 = fVar244 - fVar227;
        fVar177 = fVar247 - fVar229;
        fVar171 = fVar253 - fVar238;
        fVar248 = (fVar259 * fVar222 - fVar241 * fVar191) * 0.0 +
                  (fVar241 * fVar178 - fVar256 * fVar222) * 0.0 +
                  (fVar256 * fVar191 - fVar259 * fVar178);
        fVar249 = (fVar132 * fVar226 - fVar244 * fVar208) * 0.0 +
                  (fVar244 * fVar185 - fVar133 * fVar226) * 0.0 +
                  (fVar133 * fVar208 - fVar132 * fVar185);
        auVar126._4_4_ = fVar249;
        auVar126._0_4_ = fVar248;
        fVar254 = (fVar136 * fVar228 - fVar247 * fVar211) * 0.0 +
                  (fVar247 * fVar187 - fVar137 * fVar228) * 0.0 +
                  (fVar137 * fVar211 - fVar136 * fVar187);
        fVar255 = (fVar139 * fVar230 - fVar253 * fVar213) * 0.0 +
                  (fVar253 * fVar189 - fVar140 * fVar230) * 0.0 +
                  (fVar140 * fVar213 - fVar139 * fVar189);
        auVar268._0_4_ =
             (fVar142 * fVar120 - fVar225 * fVar122) * 0.0 +
             (fVar225 * fVar257 - fVar131 * fVar120) * 0.0 + (fVar131 * fVar122 - fVar142 * fVar257)
        ;
        auVar268._4_4_ =
             (fVar155 * fVar154 - fVar227 * fVar190) * 0.0 +
             (fVar227 * fVar258 - fVar207 * fVar154) * 0.0 + (fVar207 * fVar190 - fVar155 * fVar258)
        ;
        auVar268._8_4_ =
             (fVar156 * fVar177 - fVar229 * fVar210) * 0.0 +
             (fVar229 * fVar260 - fVar215 * fVar177) * 0.0 + (fVar215 * fVar210 - fVar156 * fVar260)
        ;
        auVar268._12_4_ =
             (fVar173 * fVar171 - fVar238 * fVar220) * 0.0 +
             (fVar238 * fVar261 - fVar221 * fVar171) * 0.0 + (fVar221 * fVar220 - fVar173 * fVar261)
        ;
        auVar126._8_4_ = fVar254;
        auVar126._12_4_ = fVar255;
        auVar65 = maxps(auVar126,auVar268);
        bVar31 = auVar65._0_4_ <= 0.0 && bVar31;
        auVar127._0_4_ = -(uint)bVar31;
        bVar32 = auVar65._4_4_ <= 0.0 && bVar32;
        auVar127._4_4_ = -(uint)bVar32;
        bVar45 = auVar65._8_4_ <= 0.0 && bVar45;
        auVar127._8_4_ = -(uint)bVar45;
        bVar44 = auVar65._12_4_ <= 0.0 && bVar44;
        auVar127._12_4_ = -(uint)bVar44;
        iVar34 = movmskps(iVar34,auVar127);
        if (iVar34 == 0) {
LAB_00b9f1bc:
          auVar80._8_8_ = uStack_380;
          auVar80._0_8_ = local_388;
        }
        else {
          fVar131 = fVar122 * fVar222 - fVar120 * fVar191;
          fVar207 = fVar190 * fVar226 - fVar154 * fVar208;
          fVar215 = fVar210 * fVar228 - fVar177 * fVar211;
          fVar221 = fVar220 * fVar230 - fVar171 * fVar213;
          fVar120 = fVar120 * fVar178 - fVar222 * fVar257;
          fVar154 = fVar154 * fVar185 - fVar226 * fVar258;
          fVar177 = fVar177 * fVar187 - fVar228 * fVar260;
          fVar171 = fVar171 * fVar189 - fVar230 * fVar261;
          fVar122 = fVar257 * fVar191 - fVar122 * fVar178;
          fVar190 = fVar258 * fVar208 - fVar190 * fVar185;
          fVar210 = fVar260 * fVar211 - fVar210 * fVar187;
          fVar220 = fVar261 * fVar213 - fVar220 * fVar189;
          auVar147._0_12_ = ZEXT812(0);
          auVar147._12_4_ = 0;
          auVar167._0_4_ = fVar131 * 0.0 + fVar120 * 0.0 + fVar122;
          auVar167._4_4_ = fVar207 * 0.0 + fVar154 * 0.0 + fVar190;
          auVar167._8_4_ = fVar215 * 0.0 + fVar177 * 0.0 + fVar210;
          auVar167._12_4_ = fVar221 * 0.0 + fVar171 * 0.0 + fVar220;
          auVar65 = rcpps(auVar147,auVar167);
          fVar142 = auVar65._0_4_;
          fVar155 = auVar65._4_4_;
          fVar156 = auVar65._8_4_;
          fVar173 = auVar65._12_4_;
          fVar142 = (1.0 - auVar167._0_4_ * fVar142) * fVar142 + fVar142;
          fVar155 = (1.0 - auVar167._4_4_ * fVar155) * fVar155 + fVar155;
          fVar156 = (1.0 - auVar167._8_4_ * fVar156) * fVar156 + fVar156;
          fVar173 = (1.0 - auVar167._12_4_ * fVar173) * fVar173 + fVar173;
          fVar122 = (fVar241 * fVar122 + fVar259 * fVar120 + fVar256 * fVar131) * fVar142;
          fVar154 = (fVar244 * fVar190 + fVar132 * fVar154 + fVar133 * fVar207) * fVar155;
          fVar177 = (fVar247 * fVar210 + fVar136 * fVar177 + fVar137 * fVar215) * fVar156;
          fVar171 = (fVar253 * fVar220 + fVar139 * fVar171 + fVar140 * fVar221) * fVar173;
          fVar120 = *(float *)(ray + k * 4 + 0x80);
          bVar31 = (fVar92 <= fVar122 && fVar122 <= fVar120) && bVar31;
          auVar148._0_4_ = -(uint)bVar31;
          bVar32 = (fVar92 <= fVar154 && fVar154 <= fVar120) && bVar32;
          auVar148._4_4_ = -(uint)bVar32;
          bVar45 = (fVar92 <= fVar177 && fVar177 <= fVar120) && bVar45;
          auVar148._8_4_ = -(uint)bVar45;
          bVar44 = (fVar92 <= fVar171 && fVar171 <= fVar120) && bVar44;
          auVar148._12_4_ = -(uint)bVar44;
          iVar34 = movmskps(iVar34,auVar148);
          if (iVar34 == 0) goto LAB_00b9f1bc;
          auVar149._0_8_ =
               CONCAT44(-(uint)(auVar167._4_4_ != 0.0 && bVar32),
                        -(uint)(auVar167._0_4_ != 0.0 && bVar31));
          auVar149._8_4_ = -(uint)(auVar167._8_4_ != 0.0 && bVar45);
          auVar149._12_4_ = -(uint)(auVar167._12_4_ != 0.0 && bVar44);
          iVar34 = movmskps(iVar34,auVar149);
          auVar80._8_8_ = uStack_380;
          auVar80._0_8_ = local_388;
          if (iVar34 != 0) {
            fVar248 = fVar248 * fVar142;
            fVar249 = fVar249 * fVar155;
            fVar254 = fVar254 * fVar156;
            fVar255 = fVar255 * fVar173;
            local_68 = (float)((uint)(1.0 - fVar248) & uVar48 | ~uVar48 & (uint)fVar248);
            fStack_64 = (float)((uint)(1.0 - fVar249) & uVar50 | ~uVar50 & (uint)fVar249);
            fStack_60 = (float)((uint)(1.0 - fVar254) & uVar49 | ~uVar49 & (uint)fVar254);
            fStack_5c = (float)((uint)(1.0 - fVar255) & uVar51 | ~uVar51 & (uint)fVar255);
            local_288 = (float)(~uVar48 & (uint)(auVar268._0_4_ * fVar142) |
                               (uint)(1.0 - auVar268._0_4_ * fVar142) & uVar48);
            fStack_284 = (float)(~uVar50 & (uint)(auVar268._4_4_ * fVar155) |
                                (uint)(1.0 - auVar268._4_4_ * fVar155) & uVar50);
            fStack_280 = (float)(~uVar49 & (uint)(auVar268._8_4_ * fVar156) |
                                (uint)(1.0 - auVar268._8_4_ * fVar156) & uVar49);
            fStack_27c = (float)(~uVar51 & (uint)(auVar268._12_4_ * fVar173) |
                                (uint)(1.0 - auVar268._12_4_ * fVar173) & uVar51);
            auVar80._8_4_ = auVar149._8_4_;
            auVar80._0_8_ = auVar149._0_8_;
            auVar80._12_4_ = auVar149._12_4_;
            fVar271 = fVar122;
            fVar273 = fVar154;
            fVar275 = fVar177;
            fVar277 = fVar171;
          }
        }
        uVar188 = *(undefined8 *)(pfVar2 + 2);
        uVar179 = *(undefined8 *)pfVar2;
        uVar175 = *(undefined8 *)(pfVar1 + 2);
        uVar158 = *(undefined8 *)pfVar1;
        iVar34 = movmskps(iVar34,auVar80);
        if (iVar34 == 0) goto LAB_00b9f142;
        fVar157 = (auVar223._0_4_ - fVar157) * local_68 + fVar157;
        fVar172 = (auVar223._4_4_ - fVar172) * fStack_64 + fVar172;
        fVar174 = (auVar223._8_4_ - fVar174) * fStack_60 + fVar174;
        fVar176 = (auVar223._12_4_ - fVar176) * fStack_5c + fVar176;
        fVar120 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
        local_1a8._0_4_ = -(uint)(fVar120 * (fVar157 + fVar157) < fVar271) & auVar80._0_4_;
        local_1a8._4_4_ = -(uint)(fVar120 * (fVar172 + fVar172) < fVar273) & auVar80._4_4_;
        local_1a8._8_4_ = -(uint)(fVar120 * (fVar174 + fVar174) < fVar275) & auVar80._8_4_;
        local_1a8._12_4_ = -(uint)(fVar120 * (fVar176 + fVar176) < fVar277) & auVar80._12_4_;
        uVar48 = movmskps(iVar34,local_1a8);
        if (uVar48 == 0) goto LAB_00b9f14b;
        local_288 = local_288 + local_288 + -1.0;
        fStack_284 = fStack_284 + fStack_284 + -1.0;
        fStack_280 = fStack_280 + fStack_280 + -1.0;
        fStack_27c = fStack_27c + fStack_27c + -1.0;
        local_228 = local_68;
        fStack_224 = fStack_64;
        fStack_220 = fStack_60;
        fStack_21c = fStack_5c;
        local_1f8 = 0;
        if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          bVar44 = false;
        }
        else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                (bVar44 = true, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          fVar109 = 1.0 / fVar109;
          local_198[0] = fVar109 * (local_68 + 0.0);
          local_198[1] = fVar109 * (fStack_64 + 1.0);
          local_198[2] = fVar109 * (fStack_60 + 2.0);
          local_198[3] = fVar109 * (fStack_5c + 3.0);
          local_188 = CONCAT44(fStack_284,local_288);
          uStack_180 = CONCAT44(fStack_27c,fStack_280);
          local_178 = CONCAT44(fVar273,fVar271);
          uStack_170 = CONCAT44(fVar277,fVar275);
          pGVar39 = (Geometry *)(ulong)(byte)uVar48;
          uVar42 = 0;
          if (pGVar39 != (Geometry *)0x0) {
            for (; ((byte)uVar48 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
            }
          }
          local_3c8 = CONCAT44(uVar47,uVar47);
          uStack_3c0 = CONCAT44(uVar47,uVar47);
          uVar12 = *(undefined8 *)*local_320;
          uVar13 = *(undefined8 *)(*local_320 + 8);
          bVar44 = true;
          local_218 = local_288;
          fStack_214 = fStack_284;
          fStack_210 = fStack_280;
          fStack_20c = fStack_27c;
          local_208 = fVar271;
          fStack_204 = fVar273;
          fStack_200 = fVar275;
          fStack_1fc = fVar277;
          local_1f4 = iVar7;
          local_1e8 = fVar121;
          fStack_1e4 = fVar53;
          fStack_1e0 = fVar54;
          fStack_1dc = fVar88;
          uStack_1d0 = uVar11;
          local_1c8 = uVar158;
          uStack_1c0 = uVar175;
          local_1b8 = uVar179;
          uStack_1b0 = uVar188;
          local_1d8 = fVar89;
          fStack_1d4 = fVar91;
          do {
            local_e8 = local_198[uVar42];
            uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
            local_d8 = *(undefined4 *)((long)&local_188 + uVar42 * 4);
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)((long)&local_178 + uVar42 * 4);
            fVar142 = 1.0 - local_e8;
            fVar92 = local_e8 * fVar142 * 4.0;
            fVar154 = (fVar142 * fVar142 + fVar92) * 0.5;
            fVar109 = local_e8 * local_e8 * 0.5;
            local_498._0_4_ = (float)uVar179;
            local_498._4_4_ = (float)((ulong)uVar179 >> 0x20);
            uStack_490._0_4_ = (float)uVar188;
            local_418 = (float)uVar158;
            fStack_414 = (float)((ulong)uVar158 >> 0x20);
            fStack_410 = (float)uVar175;
            fVar120 = (-local_e8 * local_e8 - fVar92) * 0.5;
            fStack_480 = (float)uVar11;
            local_318.context = context->user;
            fVar92 = -fVar142 * fVar142 * 0.5;
            local_118 = fVar92 * fVar121 +
                        fVar120 * fVar89 + fVar154 * local_418 + fVar109 * (float)local_498;
            local_108 = fVar92 * fVar53 +
                        fVar120 * fVar91 + fVar154 * fStack_414 + fVar109 * local_498._4_4_;
            local_f8 = fVar92 * fVar54 +
                       fVar120 * fStack_480 + fVar154 * fStack_410 + fVar109 * (float)uStack_490;
            fStack_114 = local_118;
            fStack_110 = local_118;
            fStack_10c = local_118;
            fStack_104 = local_108;
            fStack_100 = local_108;
            fStack_fc = local_108;
            fStack_f4 = local_f8;
            fStack_f0 = local_f8;
            fStack_ec = local_f8;
            fStack_e4 = local_e8;
            fStack_e0 = local_e8;
            fStack_dc = local_e8;
            uStack_d4 = local_d8;
            uStack_d0 = local_d8;
            uStack_cc = local_d8;
            local_c8 = local_3c8;
            uStack_c0 = uStack_3c0;
            local_b8 = CONCAT44(uVar46,uVar46);
            uStack_b0 = CONCAT44(uVar46,uVar46);
            local_a8 = (local_318.context)->instID[0];
            uStack_a4 = local_a8;
            uStack_a0 = local_a8;
            uStack_9c = local_a8;
            local_98 = (local_318.context)->instPrimID[0];
            uStack_94 = local_98;
            uStack_90 = local_98;
            uStack_8c = local_98;
            local_318.valid = (int *)&local_3a8;
            local_318.geometryUserPtr = pGVar8->userPtr;
            local_318.hit = (RTCHitN *)&local_118;
            local_318.N = 4;
            p_Var35 = pGVar8->occlusionFilterN;
            local_3a8 = uVar12;
            uStack_3a0 = uVar13;
            local_318.ray = (RTCRayN *)ray;
            if (p_Var35 != (RTCFilterFunctionN)0x0) {
              p_Var35 = (RTCFilterFunctionN)(*p_Var35)(&local_318);
            }
            auVar81._0_4_ = -(uint)((int)local_3a8 == 0);
            auVar81._4_4_ = -(uint)(local_3a8._4_4_ == 0);
            auVar81._8_4_ = -(uint)((int)uStack_3a0 == 0);
            auVar81._12_4_ = -(uint)(uStack_3a0._4_4_ == 0);
            uVar47 = movmskps((int)p_Var35,auVar81);
            pRVar36 = (RTCRayN *)(ulong)(uVar47 ^ 0xf);
            if ((uVar47 ^ 0xf) == 0) {
              auVar81 = auVar81 ^ _DAT_01febe20;
            }
            else {
              p_Var35 = context->args->filter;
              if ((p_Var35 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                (*p_Var35)(&local_318);
              }
              auVar105._0_4_ = -(uint)((int)local_3a8 == 0);
              auVar105._4_4_ = -(uint)(local_3a8._4_4_ == 0);
              auVar105._8_4_ = -(uint)((int)uStack_3a0 == 0);
              auVar105._12_4_ = -(uint)(uStack_3a0._4_4_ == 0);
              auVar81 = auVar105 ^ _DAT_01febe20;
              *(undefined1 (*) [16])(local_318.ray + 0x80) =
                   ~auVar105 & _DAT_01feba00 |
                   *(undefined1 (*) [16])(local_318.ray + 0x80) & auVar105;
              pRVar36 = local_318.ray;
            }
            auVar82._0_4_ = auVar81._0_4_ << 0x1f;
            auVar82._4_4_ = auVar81._4_4_ << 0x1f;
            auVar82._8_4_ = auVar81._8_4_ << 0x1f;
            auVar82._12_4_ = auVar81._12_4_ << 0x1f;
            iVar34 = movmskps((int)pRVar36,auVar82);
            uVar48 = (uint)uVar42;
            if (iVar34 != 0) break;
            *(undefined4 *)(ray + k * 4 + 0x80) = uVar6;
            pGVar39 = (Geometry *)((ulong)pGVar39 ^ 1L << (uVar42 & 0x3f));
            uVar42 = 0;
            if (pGVar39 != (Geometry *)0x0) {
              for (; ((ulong)pGVar39 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
              }
            }
            bVar44 = pGVar39 != (Geometry *)0x0;
          } while (bVar44);
        }
      }
      if (4 < iVar7) {
        local_78 = iVar7;
        iStack_74 = iVar7;
        iStack_70 = iVar7;
        iStack_6c = iVar7;
        local_358._4_4_ = local_358._0_4_;
        fStack_350 = (float)local_358._0_4_;
        fStack_34c = (float)local_358._0_4_;
        local_88 = 1.0 / (float)local_2e8._0_4_;
        fStack_84 = local_88;
        fStack_80 = local_88;
        fStack_7c = local_88;
        local_2e8._4_4_ = (undefined4)local_390;
        local_2e8._0_4_ = (undefined4)local_390;
        local_2e8._8_4_ = (undefined4)local_390;
        local_2e8._12_4_ = (undefined4)local_390;
        local_2d8 = CONCAT44((uint)local_2d8,(uint)local_2d8);
        uStack_2d0 = (uint)local_2d8;
        uStack_2cc = (uint)local_2d8;
        lVar40 = 4;
        fStack_344 = local_348;
        fStack_340 = local_348;
        fStack_33c = local_348;
        do {
          fVar253 = fStack_250;
          fVar247 = fStack_254;
          fVar244 = local_258;
          fVar241 = fStack_360;
          fVar238 = fStack_364;
          fVar230 = local_368;
          fVar229 = fStack_370;
          fVar228 = fStack_374;
          fVar227 = local_378;
          local_1f8 = (uint)lVar40;
          pauVar3 = (undefined1 (*) [12])(bspline_basis0 + lVar40 * 4 + lVar10);
          fVar89 = *(float *)*pauVar3;
          fVar91 = *(float *)(*pauVar3 + 4);
          fVar92 = *(float *)(*pauVar3 + 8);
          auVar18 = *pauVar3;
          fVar109 = *(float *)pauVar3[1];
          pauVar3 = (undefined1 (*) [12])(lVar10 + 0x222bfac + lVar40 * 4);
          fVar120 = *(float *)*pauVar3;
          fVar142 = *(float *)(*pauVar3 + 4);
          fVar154 = *(float *)(*pauVar3 + 8);
          auVar17 = *pauVar3;
          fVar155 = *(float *)pauVar3[1];
          pauVar3 = (undefined1 (*) [12])(lVar10 + 0x222c430 + lVar40 * 4);
          fVar177 = *(float *)*pauVar3;
          fVar156 = *(float *)(*pauVar3 + 4);
          fVar171 = *(float *)(*pauVar3 + 8);
          auVar16 = *pauVar3;
          fVar173 = *(float *)pauVar3[1];
          pfVar1 = (float *)(lVar10 + 0x222c8b4 + lVar40 * 4);
          fVar122 = *pfVar1;
          fVar131 = pfVar1[1];
          fVar190 = pfVar1[2];
          fVar207 = pfVar1[3];
          fVar248 = local_2b8 * fVar89 +
                    local_268 * fVar120 + local_338 * fVar177 + fVar111 * fVar122;
          fVar249 = fStack_2b4 * fVar91 +
                    fStack_264 * fVar142 + fStack_334 * fVar156 + fVar111 * fVar131;
          fVar254 = fStack_2b0 * fVar92 +
                    fStack_260 * fVar154 + fStack_330 * fVar171 + fVar111 * fVar190;
          fVar255 = fStack_2ac * fVar109 +
                    fStack_25c * fVar155 + fStack_32c * fVar173 + fVar111 * fVar207;
          fVar256 = local_248 * fVar89 + local_2c8 * fVar120 + fVar186 * fVar177 + fVar114 * fVar122
          ;
          fVar132 = fStack_244 * fVar91 +
                    fStack_2c4 * fVar142 + fVar186 * fVar156 + fVar114 * fVar131;
          fVar136 = fStack_240 * fVar92 +
                    fStack_2c0 * fVar154 + fVar186 * fVar171 + fVar114 * fVar190;
          fVar139 = fStack_23c * fVar109 +
                    fStack_2bc * fVar155 + fVar186 * fVar173 + fVar114 * fVar207;
          fVar157 = local_148 * fVar89 +
                    local_138 * fVar120 + local_128 * fVar177 + local_58 * fVar122;
          fVar172 = fStack_144 * fVar91 +
                    fStack_134 * fVar142 + fStack_124 * fVar156 + fStack_54 * fVar131;
          auVar219._4_4_ = fVar172;
          auVar219._0_4_ = fVar157;
          fVar174 = fStack_140 * fVar92 +
                    fStack_130 * fVar154 + fStack_120 * fVar171 + fStack_50 * fVar190;
          fVar176 = fStack_13c * fVar109 +
                    fStack_12c * fVar155 + fStack_11c * fVar173 + fStack_4c * fVar207;
          puVar37 = bspline_basis1 + lVar10;
          pfVar1 = (float *)(puVar37 + lVar40 * 4);
          fVar89 = *pfVar1;
          fVar91 = pfVar1[1];
          fVar92 = pfVar1[2];
          fVar120 = pfVar1[3];
          pfVar1 = (float *)(lVar10 + 0x222e3cc + lVar40 * 4);
          fVar142 = *pfVar1;
          fVar154 = pfVar1[1];
          fVar177 = pfVar1[2];
          fVar156 = pfVar1[3];
          pfVar1 = (float *)(lVar10 + 0x222e850 + lVar40 * 4);
          fVar171 = *pfVar1;
          fVar210 = pfVar1[1];
          fVar215 = pfVar1[2];
          fVar220 = pfVar1[3];
          pfVar1 = (float *)(lVar10 + 0x222ecd4 + lVar40 * 4);
          fVar221 = *pfVar1;
          fVar222 = pfVar1[1];
          fVar225 = pfVar1[2];
          fVar226 = pfVar1[3];
          fVar178 = local_2b8 * fVar89 +
                    local_268 * fVar142 + local_338 * fVar171 + fVar111 * fVar221;
          fVar187 = fStack_2b4 * fVar91 +
                    fStack_264 * fVar154 + fStack_334 * fVar210 + fVar111 * fVar222;
          fVar191 = fStack_2b0 * fVar92 +
                    fStack_260 * fVar177 + fStack_330 * fVar215 + fVar111 * fVar225;
          fVar211 = fStack_2ac * fVar120 +
                    fStack_25c * fVar156 + fStack_32c * fVar220 + fVar111 * fVar226;
          fVar257 = local_248 * fVar89 + local_2c8 * fVar142 + fVar186 * fVar171 + fVar114 * fVar221
          ;
          fVar258 = fStack_244 * fVar91 +
                    fStack_2c4 * fVar154 + fVar186 * fVar210 + fVar114 * fVar222;
          fVar260 = fStack_240 * fVar92 +
                    fStack_2c0 * fVar177 + fVar186 * fVar215 + fVar114 * fVar225;
          fVar261 = fStack_23c * fVar120 +
                    fStack_2bc * fVar156 + fVar186 * fVar220 + fVar114 * fVar226;
          auVar128._0_4_ =
               local_148 * fVar89 + local_138 * fVar142 + local_128 * fVar171 + local_58 * fVar221;
          auVar128._4_4_ =
               fStack_144 * fVar91 +
               fStack_134 * fVar154 + fStack_124 * fVar210 + fStack_54 * fVar222;
          auVar128._8_4_ =
               fStack_140 * fVar92 +
               fStack_130 * fVar177 + fStack_120 * fVar215 + fStack_50 * fVar225;
          auVar128._12_4_ =
               fStack_13c * fVar120 +
               fStack_12c * fVar156 + fStack_11c * fVar220 + fStack_4c * fVar226;
          local_278 = fVar178 - fVar248;
          fStack_274 = fVar187 - fVar249;
          fStack_270 = fVar191 - fVar254;
          fStack_26c = fVar211 - fVar255;
          fVar185 = fVar257 - fVar256;
          fVar189 = fVar258 - fVar132;
          fVar208 = fVar260 - fVar136;
          fVar213 = fVar261 - fVar139;
          fVar259 = fVar256 * local_278 - fVar248 * fVar185;
          fVar133 = fVar132 * fStack_274 - fVar249 * fVar189;
          fVar137 = fVar136 * fStack_270 - fVar254 * fVar208;
          fVar140 = fVar139 * fStack_26c - fVar255 * fVar213;
          auVar219._8_4_ = fVar174;
          auVar219._12_4_ = fVar176;
          auVar65 = maxps(auVar219,auVar128);
          bVar31 = fVar259 * fVar259 <=
                   auVar65._0_4_ * auVar65._0_4_ * (local_278 * local_278 + fVar185 * fVar185) &&
                   (int)local_1f8 < local_78;
          auVar107._0_4_ = -(uint)bVar31;
          bVar45 = (int)(local_1f8 | 1) < iStack_74 &&
                   fVar133 * fVar133 <=
                   auVar65._4_4_ * auVar65._4_4_ * (fStack_274 * fStack_274 + fVar189 * fVar189);
          auVar107._4_4_ = -(uint)bVar45;
          bVar32 = fVar137 * fVar137 <=
                   auVar65._8_4_ * auVar65._8_4_ * (fStack_270 * fStack_270 + fVar208 * fVar208) &&
                   (int)(local_1f8 | 2) < iStack_70;
          auVar107._8_4_ = -(uint)bVar32;
          bVar33 = fVar140 * fVar140 <=
                   auVar65._12_4_ * auVar65._12_4_ * (fStack_26c * fStack_26c + fVar213 * fVar213)
                   && (int)(local_1f8 | 3) < iStack_6c;
          auVar107._12_4_ = -(uint)bVar33;
          uVar46 = movmskps((int)pGVar39,auVar107);
          pGVar39 = (Geometry *)(ulong)uVar46;
          if (uVar46 == 0) {
LAB_00ba00b4:
            uVar48 = (uint)puVar37;
          }
          else {
            fVar209 = fVar221 * fVar95 + fVar171 * local_2a8 + fVar142 * fVar184 + fVar89 * fVar135;
            fVar212 = fVar222 * fVar95 + fVar210 * fStack_2a4 + fVar154 * fVar184 + fVar91 * fVar135
            ;
            fVar214 = fVar225 * fVar95 + fVar215 * fStack_2a0 + fVar177 * fVar184 + fVar92 * fVar135
            ;
            fVar231 = fVar226 * fVar95 + fVar220 * fStack_29c + fVar156 * fVar184 +
                      fVar120 * fVar135;
            local_4a8 = auVar18._0_4_;
            fStack_4a4 = auVar18._4_4_;
            fStack_4a0 = auVar18._8_4_;
            local_418 = auVar17._0_4_;
            fStack_414 = auVar17._4_4_;
            fStack_410 = auVar17._8_4_;
            local_498._0_4_ = auVar16._0_4_;
            local_498._4_4_ = auVar16._4_4_;
            uStack_490._0_4_ = auVar16._8_4_;
            fVar90 = fVar122 * fVar95 + (float)local_498 * local_2a8 + local_418 * fVar184 +
                     local_4a8 * fVar135;
            fVar93 = fVar131 * fVar95 + local_498._4_4_ * fStack_2a4 + fStack_414 * fVar184 +
                     fStack_4a4 * fVar135;
            fVar94 = fVar190 * fVar95 + (float)uStack_490 * fStack_2a0 + fStack_410 * fVar184 +
                     fStack_4a0 * fVar135;
            fVar96 = fVar207 * fVar95 + fVar173 * fStack_29c + fVar155 * fVar184 + fVar109 * fVar135
            ;
            pfVar1 = (float *)(lVar10 + 0x222cd38 + lVar40 * 4);
            fVar89 = *pfVar1;
            fVar91 = pfVar1[1];
            fVar92 = pfVar1[2];
            fVar109 = pfVar1[3];
            pfVar1 = (float *)(lVar10 + 0x222d1bc + lVar40 * 4);
            fVar120 = *pfVar1;
            fVar142 = pfVar1[1];
            fVar154 = pfVar1[2];
            fVar155 = pfVar1[3];
            pfVar1 = (float *)(lVar10 + 0x222d640 + lVar40 * 4);
            fVar177 = *pfVar1;
            fVar156 = pfVar1[1];
            fVar171 = pfVar1[2];
            fVar173 = pfVar1[3];
            pfVar1 = (float *)(lVar10 + 0x222dac4 + lVar40 * 4);
            fVar122 = *pfVar1;
            fVar131 = pfVar1[1];
            fVar190 = pfVar1[2];
            fVar207 = pfVar1[3];
            fVar239 = local_2b8 * fVar89 +
                      local_268 * fVar120 + local_338 * fVar177 + fVar111 * fVar122;
            fVar242 = fStack_2b4 * fVar91 +
                      fStack_264 * fVar142 + fStack_334 * fVar156 + fVar111 * fVar131;
            fVar245 = fStack_2b0 * fVar92 +
                      fStack_260 * fVar154 + fStack_330 * fVar171 + fVar111 * fVar190;
            fVar272 = fStack_2ac * fVar109 +
                      fStack_25c * fVar155 + fStack_32c * fVar173 + fVar111 * fVar207;
            fVar110 = local_248 * fVar89 +
                      local_2c8 * fVar120 + fVar186 * fVar177 + fVar114 * fVar122;
            fVar112 = fStack_244 * fVar91 +
                      fStack_2c4 * fVar142 + fVar186 * fVar156 + fVar114 * fVar131;
            fVar113 = fStack_240 * fVar92 +
                      fStack_2c0 * fVar154 + fVar186 * fVar171 + fVar114 * fVar190;
            fVar123 = fStack_23c * fVar109 +
                      fStack_2bc * fVar155 + fVar186 * fVar173 + fVar114 * fVar207;
            pfVar1 = (float *)(lVar10 + 0x222f158 + lVar40 * 4);
            fVar210 = *pfVar1;
            fVar215 = pfVar1[1];
            fVar220 = pfVar1[2];
            fVar221 = pfVar1[3];
            pfVar1 = (float *)(lVar10 + 0x222fa60 + lVar40 * 4);
            fVar222 = *pfVar1;
            fVar225 = pfVar1[1];
            fVar226 = pfVar1[2];
            fVar259 = pfVar1[3];
            pfVar1 = (float *)(lVar10 + 0x222fee4 + lVar40 * 4);
            fVar133 = *pfVar1;
            fVar137 = pfVar1[1];
            fVar140 = pfVar1[2];
            fVar232 = pfVar1[3];
            pfVar1 = (float *)(lVar10 + 0x222f5dc + lVar40 * 4);
            fVar240 = *pfVar1;
            fVar243 = pfVar1[1];
            fVar246 = pfVar1[2];
            fVar55 = pfVar1[3];
            fVar274 = local_2b8 * fVar210 +
                      local_268 * fVar240 + local_338 * fVar222 + fVar111 * fVar133;
            fVar276 = fStack_2b4 * fVar215 +
                      fStack_264 * fVar243 + fStack_334 * fVar225 + fVar111 * fVar137;
            fVar278 = fStack_2b0 * fVar220 +
                      fStack_260 * fVar246 + fStack_330 * fVar226 + fVar111 * fVar140;
            fVar270 = fStack_2ac * fVar221 +
                      fStack_25c * fVar55 + fStack_32c * fVar259 + fVar111 * fVar232;
            fVar134 = local_248 * fVar210 +
                      local_2c8 * fVar240 + fVar186 * fVar222 + fVar114 * fVar133;
            fVar138 = fStack_244 * fVar215 +
                      fStack_2c4 * fVar243 + fVar186 * fVar225 + fVar114 * fVar137;
            fVar141 = fStack_240 * fVar220 +
                      fStack_2c0 * fVar246 + fVar186 * fVar226 + fVar114 * fVar140;
            fVar192 = fStack_23c * fVar221 +
                      fStack_2bc * fVar55 + fVar186 * fVar259 + fVar114 * fVar232;
            auVar252._0_8_ = CONCAT44(fVar242,fVar239) & 0x7fffffff7fffffff;
            auVar252._8_4_ = ABS(fVar245);
            auVar252._12_4_ = ABS(fVar272);
            auVar168._0_8_ = CONCAT44(fVar112,fVar110) & 0x7fffffff7fffffff;
            auVar168._8_4_ = ABS(fVar113);
            auVar168._12_4_ = ABS(fVar123);
            auVar65 = maxps(auVar252,auVar168);
            auVar266._0_8_ =
                 CONCAT44(fVar91 * fVar135 +
                          fVar142 * fVar184 + fVar156 * fStack_2a4 + fVar131 * fVar95,
                          fVar89 * fVar135 +
                          fVar120 * fVar184 + fVar177 * local_2a8 + fVar122 * fVar95) &
                 0x7fffffff7fffffff;
            auVar266._8_4_ =
                 ABS(fVar92 * fVar135 + fVar154 * fVar184 + fVar171 * fStack_2a0 + fVar190 * fVar95)
            ;
            auVar266._12_4_ =
                 ABS(fVar109 * fVar135 + fVar155 * fVar184 + fVar173 * fStack_29c + fVar207 * fVar95
                    );
            auVar65 = maxps(auVar65,auVar266);
            uVar46 = -(uint)(local_348 <= auVar65._0_4_);
            uVar47 = -(uint)(fStack_344 <= auVar65._4_4_);
            uVar48 = -(uint)(fStack_340 <= auVar65._8_4_);
            uVar50 = -(uint)(fStack_33c <= auVar65._12_4_);
            auVar169._0_4_ = ~uVar46 & (uint)local_278;
            auVar169._4_4_ = ~uVar47 & (uint)fStack_274;
            auVar169._8_4_ = ~uVar48 & (uint)fStack_270;
            auVar169._12_4_ = ~uVar50 & (uint)fStack_26c;
            auVar237._0_4_ = (uint)fVar239 & uVar46;
            auVar237._4_4_ = (uint)fVar242 & uVar47;
            auVar237._8_4_ = (uint)fVar245 & uVar48;
            auVar237._12_4_ = (uint)fVar272 & uVar50;
            auVar237 = auVar237 | auVar169;
            fVar156 = (float)(~uVar46 & (uint)fVar185 | (uint)fVar110 & uVar46);
            fVar173 = (float)(~uVar47 & (uint)fVar189 | (uint)fVar112 & uVar47);
            fVar110 = (float)(~uVar48 & (uint)fVar208 | (uint)fVar113 & uVar48);
            fVar112 = (float)(~uVar50 & (uint)fVar213 | (uint)fVar123 & uVar50);
            auVar267._0_8_ = CONCAT44(fVar276,fVar274) & 0x7fffffff7fffffff;
            auVar267._8_4_ = ABS(fVar278);
            auVar267._12_4_ = ABS(fVar270);
            auVar117._0_8_ = CONCAT44(fVar138,fVar134) & 0x7fffffff7fffffff;
            auVar117._8_4_ = ABS(fVar141);
            auVar117._12_4_ = ABS(fVar192);
            auVar65 = maxps(auVar267,auVar117);
            auVar83._0_8_ =
                 CONCAT44(fVar215 * fVar135 +
                          fVar243 * fVar184 + fVar225 * fStack_2a4 + fVar137 * fVar95,
                          fVar210 * fVar135 +
                          fVar240 * fVar184 + fVar222 * local_2a8 + fVar133 * fVar95) &
                 0x7fffffff7fffffff;
            auVar83._8_4_ =
                 ABS(fVar220 * fVar135 + fVar246 * fVar184 + fVar226 * fStack_2a0 + fVar140 * fVar95
                    );
            auVar83._12_4_ =
                 ABS(fVar221 * fVar135 + fVar55 * fVar184 + fVar259 * fStack_29c + fVar232 * fVar95)
            ;
            auVar65 = maxps(auVar65,auVar83);
            uVar46 = -(uint)(local_348 <= auVar65._0_4_);
            uVar47 = -(uint)(fStack_344 <= auVar65._4_4_);
            uVar48 = -(uint)(fStack_340 <= auVar65._8_4_);
            uVar50 = -(uint)(fStack_33c <= auVar65._12_4_);
            fVar222 = (float)((uint)fVar274 & uVar46 | ~uVar46 & (uint)local_278);
            fVar225 = (float)((uint)fVar276 & uVar47 | ~uVar47 & (uint)fStack_274);
            fVar226 = (float)((uint)fVar278 & uVar48 | ~uVar48 & (uint)fStack_270);
            fVar259 = (float)((uint)fVar270 & uVar50 | ~uVar50 & (uint)fStack_26c);
            fVar210 = (float)(~uVar46 & (uint)fVar185 | (uint)fVar134 & uVar46);
            fVar215 = (float)(~uVar47 & (uint)fVar189 | (uint)fVar138 & uVar47);
            fVar220 = (float)(~uVar48 & (uint)fVar208 | (uint)fVar141 & uVar48);
            fVar221 = (float)(~uVar50 & (uint)fVar213 | (uint)fVar192 & uVar50);
            fVar155 = auVar237._0_4_;
            fVar89 = auVar237._4_4_;
            fVar91 = auVar237._8_4_;
            fVar92 = auVar237._12_4_;
            auVar150._0_4_ = fVar156 * fVar156 + fVar155 * fVar155;
            auVar150._4_4_ = fVar173 * fVar173 + fVar89 * fVar89;
            auVar150._8_4_ = fVar110 * fVar110 + fVar91 * fVar91;
            auVar150._12_4_ = fVar112 * fVar112 + fVar92 * fVar92;
            auVar65 = rsqrtps(auVar169,auVar150);
            fVar109 = auVar65._0_4_;
            fVar120 = auVar65._4_4_;
            fVar142 = auVar65._8_4_;
            fVar154 = auVar65._12_4_;
            auVar170._0_4_ = fVar109 * fVar109 * auVar150._0_4_ * 0.5 * fVar109;
            auVar170._4_4_ = fVar120 * fVar120 * auVar150._4_4_ * 0.5 * fVar120;
            auVar170._8_4_ = fVar142 * fVar142 * auVar150._8_4_ * 0.5 * fVar142;
            auVar170._12_4_ = fVar154 * fVar154 * auVar150._12_4_ * 0.5 * fVar154;
            fVar122 = fVar109 * 1.5 - auVar170._0_4_;
            fVar131 = fVar120 * 1.5 - auVar170._4_4_;
            fVar190 = fVar142 * 1.5 - auVar170._8_4_;
            fVar207 = fVar154 * 1.5 - auVar170._12_4_;
            auVar151._0_4_ = fVar210 * fVar210 + fVar222 * fVar222;
            auVar151._4_4_ = fVar215 * fVar215 + fVar225 * fVar225;
            auVar151._8_4_ = fVar220 * fVar220 + fVar226 * fVar226;
            auVar151._12_4_ = fVar221 * fVar221 + fVar259 * fVar259;
            auVar65 = rsqrtps(auVar170,auVar151);
            fVar109 = auVar65._0_4_;
            fVar120 = auVar65._4_4_;
            fVar142 = auVar65._8_4_;
            fVar154 = auVar65._12_4_;
            fVar177 = fVar109 * 1.5 - fVar109 * fVar109 * auVar151._0_4_ * 0.5 * fVar109;
            fVar120 = fVar120 * 1.5 - fVar120 * fVar120 * auVar151._4_4_ * 0.5 * fVar120;
            fVar171 = fVar142 * 1.5 - fVar142 * fVar142 * auVar151._8_4_ * 0.5 * fVar142;
            fVar154 = fVar154 * 1.5 - fVar154 * fVar154 * auVar151._12_4_ * 0.5 * fVar154;
            fVar185 = fVar156 * fVar122 * fVar157;
            fVar189 = fVar173 * fVar131 * fVar172;
            fVar239 = fVar110 * fVar190 * fVar174;
            fVar245 = fVar112 * fVar207 * fVar176;
            fVar142 = -fVar155 * fVar122 * fVar157;
            fVar155 = -fVar89 * fVar131 * fVar172;
            fVar156 = -fVar91 * fVar190 * fVar174;
            fVar173 = -fVar92 * fVar207 * fVar176;
            fVar213 = fVar122 * 0.0 * fVar157;
            fVar232 = fVar131 * 0.0 * fVar172;
            fVar240 = fVar190 * 0.0 * fVar174;
            fVar243 = fVar207 * 0.0 * fVar176;
            fVar122 = fVar210 * fVar177 * auVar128._0_4_;
            fVar131 = fVar215 * fVar120 * auVar128._4_4_;
            fVar190 = fVar220 * fVar171 * auVar128._8_4_;
            fVar207 = fVar221 * fVar154 * auVar128._12_4_;
            fVar246 = fVar178 + fVar122;
            fVar55 = fVar187 + fVar131;
            fVar110 = fVar191 + fVar190;
            fVar112 = fVar211 + fVar207;
            fVar89 = -fVar222 * fVar177 * auVar128._0_4_;
            fVar91 = -fVar225 * fVar120 * auVar128._4_4_;
            fVar92 = -fVar226 * fVar171 * auVar128._8_4_;
            fVar109 = -fVar259 * fVar154 * auVar128._12_4_;
            fVar113 = fVar257 + fVar89;
            fVar123 = fVar258 + fVar91;
            fVar134 = fVar260 + fVar92;
            fVar138 = fVar261 + fVar109;
            fVar215 = fVar177 * 0.0 * auVar128._0_4_;
            fVar221 = fVar120 * 0.0 * auVar128._4_4_;
            fVar225 = fVar171 * 0.0 * auVar128._8_4_;
            fVar208 = fVar154 * 0.0 * auVar128._12_4_;
            fVar210 = fVar248 - fVar185;
            fVar220 = fVar249 - fVar189;
            fVar222 = fVar254 - fVar239;
            fVar226 = fVar255 - fVar245;
            fVar141 = fVar209 + fVar215;
            fVar192 = fVar212 + fVar221;
            fVar242 = fVar214 + fVar225;
            fVar272 = fVar231 + fVar208;
            fVar259 = fVar256 - fVar142;
            fVar133 = fVar132 - fVar155;
            fVar137 = fVar136 - fVar156;
            fVar140 = fVar139 - fVar173;
            fVar120 = fVar90 - fVar213;
            fVar154 = fVar93 - fVar232;
            fVar177 = fVar94 - fVar240;
            fVar171 = fVar96 - fVar243;
            uVar46 = -(uint)(0.0 < (fVar259 * (fVar141 - fVar120) - fVar120 * (fVar113 - fVar259)) *
                                   0.0 + (fVar120 * (fVar246 - fVar210) -
                                         (fVar141 - fVar120) * fVar210) * 0.0 +
                                         ((fVar113 - fVar259) * fVar210 -
                                         (fVar246 - fVar210) * fVar259));
            uVar47 = -(uint)(0.0 < (fVar133 * (fVar192 - fVar154) - fVar154 * (fVar123 - fVar133)) *
                                   0.0 + (fVar154 * (fVar55 - fVar220) -
                                         (fVar192 - fVar154) * fVar220) * 0.0 +
                                         ((fVar123 - fVar133) * fVar220 -
                                         (fVar55 - fVar220) * fVar133));
            uVar48 = -(uint)(0.0 < (fVar137 * (fVar242 - fVar177) - fVar177 * (fVar134 - fVar137)) *
                                   0.0 + (fVar177 * (fVar110 - fVar222) -
                                         (fVar242 - fVar177) * fVar222) * 0.0 +
                                         ((fVar134 - fVar137) * fVar222 -
                                         (fVar110 - fVar222) * fVar137));
            uVar50 = -(uint)(0.0 < (fVar140 * (fVar272 - fVar171) - fVar171 * (fVar138 - fVar140)) *
                                   0.0 + (fVar171 * (fVar112 - fVar226) -
                                         (fVar272 - fVar171) * fVar226) * 0.0 +
                                         ((fVar138 - fVar140) * fVar226 -
                                         (fVar112 - fVar226) * fVar140));
            fVar185 = (float)((uint)(fVar178 - fVar122) & uVar46 |
                             ~uVar46 & (uint)(fVar248 + fVar185));
            fVar187 = (float)((uint)(fVar187 - fVar131) & uVar47 |
                             ~uVar47 & (uint)(fVar249 + fVar189));
            fVar189 = (float)((uint)(fVar191 - fVar190) & uVar48 |
                             ~uVar48 & (uint)(fVar254 + fVar239));
            fVar191 = (float)((uint)(fVar211 - fVar207) & uVar50 |
                             ~uVar50 & (uint)(fVar255 + fVar245));
            fVar122 = (float)((uint)(fVar257 - fVar89) & uVar46 |
                             ~uVar46 & (uint)(fVar256 + fVar142));
            fVar131 = (float)((uint)(fVar258 - fVar91) & uVar47 |
                             ~uVar47 & (uint)(fVar132 + fVar155));
            fVar190 = (float)((uint)(fVar260 - fVar92) & uVar48 |
                             ~uVar48 & (uint)(fVar136 + fVar156));
            fVar207 = (float)((uint)(fVar261 - fVar109) & uVar50 |
                             ~uVar50 & (uint)(fVar139 + fVar173));
            fVar258 = (float)((uint)(fVar209 - fVar215) & uVar46 |
                             ~uVar46 & (uint)(fVar90 + fVar213));
            fVar260 = (float)((uint)(fVar212 - fVar221) & uVar47 |
                             ~uVar47 & (uint)(fVar93 + fVar232));
            fVar261 = (float)((uint)(fVar214 - fVar225) & uVar48 |
                             ~uVar48 & (uint)(fVar94 + fVar240));
            fVar232 = (float)((uint)(fVar231 - fVar208) & uVar50 |
                             ~uVar50 & (uint)(fVar96 + fVar243));
            fVar215 = (float)((uint)fVar210 & uVar46 | ~uVar46 & (uint)fVar246);
            fVar221 = (float)((uint)fVar220 & uVar47 | ~uVar47 & (uint)fVar55);
            fVar225 = (float)((uint)fVar222 & uVar48 | ~uVar48 & (uint)fVar110);
            fVar256 = (float)((uint)fVar226 & uVar50 | ~uVar50 & (uint)fVar112);
            fVar132 = (float)((uint)fVar259 & uVar46 | ~uVar46 & (uint)fVar113);
            fVar136 = (float)((uint)fVar133 & uVar47 | ~uVar47 & (uint)fVar123);
            fVar139 = (float)((uint)fVar137 & uVar48 | ~uVar48 & (uint)fVar134);
            fVar178 = (float)((uint)fVar140 & uVar50 | ~uVar50 & (uint)fVar138);
            fVar142 = (float)((uint)fVar120 & uVar46 | ~uVar46 & (uint)fVar141);
            fVar155 = (float)((uint)fVar154 & uVar47 | ~uVar47 & (uint)fVar192);
            fVar156 = (float)((uint)fVar177 & uVar48 | ~uVar48 & (uint)fVar242);
            fVar173 = (float)((uint)fVar171 & uVar50 | ~uVar50 & (uint)fVar272);
            fVar210 = (float)((uint)fVar246 & uVar46 | ~uVar46 & (uint)fVar210) - fVar185;
            fVar220 = (float)((uint)fVar55 & uVar47 | ~uVar47 & (uint)fVar220) - fVar187;
            fVar222 = (float)((uint)fVar110 & uVar48 | ~uVar48 & (uint)fVar222) - fVar189;
            fVar226 = (float)((uint)fVar112 & uVar50 | ~uVar50 & (uint)fVar226) - fVar191;
            fVar259 = (float)((uint)fVar113 & uVar46 | ~uVar46 & (uint)fVar259) - fVar122;
            fVar133 = (float)((uint)fVar123 & uVar47 | ~uVar47 & (uint)fVar133) - fVar131;
            fVar137 = (float)((uint)fVar134 & uVar48 | ~uVar48 & (uint)fVar137) - fVar190;
            fVar140 = (float)((uint)fVar138 & uVar50 | ~uVar50 & (uint)fVar140) - fVar207;
            fVar208 = (float)((uint)fVar141 & uVar46 | ~uVar46 & (uint)fVar120) - fVar258;
            fVar211 = (float)((uint)fVar192 & uVar47 | ~uVar47 & (uint)fVar154) - fVar260;
            fVar213 = (float)((uint)fVar242 & uVar48 | ~uVar48 & (uint)fVar177) - fVar261;
            fVar248 = (float)((uint)fVar272 & uVar50 | ~uVar50 & (uint)fVar171) - fVar232;
            fVar240 = fVar185 - fVar215;
            fVar243 = fVar187 - fVar221;
            fVar246 = fVar189 - fVar225;
            fVar55 = fVar191 - fVar256;
            fVar89 = fVar122 - fVar132;
            fVar91 = fVar131 - fVar136;
            fVar92 = fVar190 - fVar139;
            fVar109 = fVar207 - fVar178;
            fVar120 = fVar258 - fVar142;
            fVar154 = fVar260 - fVar155;
            fVar177 = fVar261 - fVar156;
            fVar171 = fVar232 - fVar173;
            fVar249 = (fVar122 * fVar208 - fVar258 * fVar259) * 0.0 +
                      (fVar258 * fVar210 - fVar185 * fVar208) * 0.0 +
                      (fVar185 * fVar259 - fVar122 * fVar210);
            fVar254 = (fVar131 * fVar211 - fVar260 * fVar133) * 0.0 +
                      (fVar260 * fVar220 - fVar187 * fVar211) * 0.0 +
                      (fVar187 * fVar133 - fVar131 * fVar220);
            auVar129._4_4_ = fVar254;
            auVar129._0_4_ = fVar249;
            fVar255 = (fVar190 * fVar213 - fVar261 * fVar137) * 0.0 +
                      (fVar261 * fVar222 - fVar189 * fVar213) * 0.0 +
                      (fVar189 * fVar137 - fVar190 * fVar222);
            fVar257 = (fVar207 * fVar248 - fVar232 * fVar140) * 0.0 +
                      (fVar232 * fVar226 - fVar191 * fVar248) * 0.0 +
                      (fVar191 * fVar140 - fVar207 * fVar226);
            auVar269._0_4_ =
                 (fVar132 * fVar120 - fVar142 * fVar89) * 0.0 +
                 (fVar142 * fVar240 - fVar215 * fVar120) * 0.0 +
                 (fVar215 * fVar89 - fVar132 * fVar240);
            auVar269._4_4_ =
                 (fVar136 * fVar154 - fVar155 * fVar91) * 0.0 +
                 (fVar155 * fVar243 - fVar221 * fVar154) * 0.0 +
                 (fVar221 * fVar91 - fVar136 * fVar243);
            auVar269._8_4_ =
                 (fVar139 * fVar177 - fVar156 * fVar92) * 0.0 +
                 (fVar156 * fVar246 - fVar225 * fVar177) * 0.0 +
                 (fVar225 * fVar92 - fVar139 * fVar246);
            auVar269._12_4_ =
                 (fVar178 * fVar171 - fVar173 * fVar109) * 0.0 +
                 (fVar173 * fVar55 - fVar256 * fVar171) * 0.0 +
                 (fVar256 * fVar109 - fVar178 * fVar55);
            auVar129._8_4_ = fVar255;
            auVar129._12_4_ = fVar257;
            auVar65 = maxps(auVar129,auVar269);
            bVar31 = auVar65._0_4_ <= 0.0 && bVar31;
            auVar130._0_4_ = -(uint)bVar31;
            bVar45 = auVar65._4_4_ <= 0.0 && bVar45;
            auVar130._4_4_ = -(uint)bVar45;
            bVar32 = auVar65._8_4_ <= 0.0 && bVar32;
            auVar130._8_4_ = -(uint)bVar32;
            bVar33 = auVar65._12_4_ <= 0.0 && bVar33;
            auVar130._12_4_ = -(uint)bVar33;
            iVar34 = movmskps((int)puVar37,auVar130);
            if (iVar34 == 0) {
LAB_00ba00e9:
              auVar119._8_8_ = uStack_380;
              auVar119._0_8_ = local_388;
            }
            else {
              fVar156 = fVar89 * fVar208 - fVar120 * fVar259;
              fVar173 = fVar91 * fVar211 - fVar154 * fVar133;
              fVar215 = fVar92 * fVar213 - fVar177 * fVar137;
              fVar221 = fVar109 * fVar248 - fVar171 * fVar140;
              fVar142 = fVar120 * fVar210 - fVar208 * fVar240;
              fVar154 = fVar154 * fVar220 - fVar211 * fVar243;
              fVar155 = fVar177 * fVar222 - fVar213 * fVar246;
              fVar177 = fVar171 * fVar226 - fVar248 * fVar55;
              fVar89 = fVar240 * fVar259 - fVar89 * fVar210;
              fVar171 = fVar243 * fVar133 - fVar91 * fVar220;
              fVar210 = fVar246 * fVar137 - fVar92 * fVar222;
              fVar220 = fVar55 * fVar140 - fVar109 * fVar226;
              auVar118._0_4_ = fVar142 * 0.0 + fVar89;
              auVar118._4_4_ = fVar154 * 0.0 + fVar171;
              auVar118._8_4_ = fVar155 * 0.0 + fVar210;
              auVar118._12_4_ = fVar177 * 0.0 + fVar220;
              auVar183._0_4_ = fVar156 * 0.0 + auVar118._0_4_;
              auVar183._4_4_ = fVar173 * 0.0 + auVar118._4_4_;
              auVar183._8_4_ = fVar215 * 0.0 + auVar118._8_4_;
              auVar183._12_4_ = fVar221 * 0.0 + auVar118._12_4_;
              auVar65 = rcpps(auVar118,auVar183);
              fVar91 = auVar65._0_4_;
              fVar92 = auVar65._4_4_;
              fVar109 = auVar65._8_4_;
              fVar120 = auVar65._12_4_;
              fVar91 = (1.0 - auVar183._0_4_ * fVar91) * fVar91 + fVar91;
              fVar92 = (1.0 - auVar183._4_4_ * fVar92) * fVar92 + fVar92;
              fVar109 = (1.0 - auVar183._8_4_ * fVar109) * fVar109 + fVar109;
              fVar120 = (1.0 - auVar183._12_4_ * fVar120) * fVar120 + fVar120;
              fVar142 = (fVar258 * fVar89 + fVar122 * fVar142 + fVar185 * fVar156) * fVar91;
              fVar154 = (fVar260 * fVar171 + fVar131 * fVar154 + fVar187 * fVar173) * fVar92;
              fVar155 = (fVar261 * fVar210 + fVar190 * fVar155 + fVar189 * fVar215) * fVar109;
              fVar177 = (fVar232 * fVar220 + fVar207 * fVar177 + fVar191 * fVar221) * fVar120;
              fVar89 = *(float *)(ray + k * 4 + 0x80);
              bVar31 = ((float)local_358._0_4_ <= fVar142 && fVar142 <= fVar89) && bVar31;
              auVar152._0_4_ = -(uint)bVar31;
              bVar45 = ((float)local_358._4_4_ <= fVar154 && fVar154 <= fVar89) && bVar45;
              auVar152._4_4_ = -(uint)bVar45;
              bVar32 = (fStack_350 <= fVar155 && fVar155 <= fVar89) && bVar32;
              auVar152._8_4_ = -(uint)bVar32;
              bVar33 = (fStack_34c <= fVar177 && fVar177 <= fVar89) && bVar33;
              auVar152._12_4_ = -(uint)bVar33;
              iVar34 = movmskps(iVar34,auVar152);
              if (iVar34 == 0) goto LAB_00ba00e9;
              auVar153._0_8_ =
                   CONCAT44(-(uint)(auVar183._4_4_ != 0.0 && bVar45),
                            -(uint)(auVar183._0_4_ != 0.0 && bVar31));
              auVar153._8_4_ = -(uint)(auVar183._8_4_ != 0.0 && bVar32);
              auVar153._12_4_ = -(uint)(auVar183._12_4_ != 0.0 && bVar33);
              iVar34 = movmskps(iVar34,auVar153);
              auVar119._8_8_ = uStack_380;
              auVar119._0_8_ = local_388;
              if (iVar34 != 0) {
                fVar249 = fVar249 * fVar91;
                fVar254 = fVar254 * fVar92;
                fVar255 = fVar255 * fVar109;
                fVar257 = fVar257 * fVar120;
                local_158 = (float)((uint)(1.0 - fVar249) & uVar46 | ~uVar46 & (uint)fVar249);
                fStack_154 = (float)((uint)(1.0 - fVar254) & uVar47 | ~uVar47 & (uint)fVar254);
                fStack_150 = (float)((uint)(1.0 - fVar255) & uVar48 | ~uVar48 & (uint)fVar255);
                fStack_14c = (float)((uint)(1.0 - fVar257) & uVar50 | ~uVar50 & (uint)fVar257);
                local_298 = (float)(~uVar46 & (uint)(auVar269._0_4_ * fVar91) |
                                   (uint)(1.0 - auVar269._0_4_ * fVar91) & uVar46);
                fStack_294 = (float)(~uVar47 & (uint)(auVar269._4_4_ * fVar92) |
                                    (uint)(1.0 - auVar269._4_4_ * fVar92) & uVar47);
                fStack_290 = (float)(~uVar48 & (uint)(auVar269._8_4_ * fVar109) |
                                    (uint)(1.0 - auVar269._8_4_ * fVar109) & uVar48);
                fStack_28c = (float)(~uVar50 & (uint)(auVar269._12_4_ * fVar120) |
                                    (uint)(1.0 - auVar269._12_4_ * fVar120) & uVar50);
                auVar119._8_4_ = auVar153._8_4_;
                auVar119._0_8_ = auVar153._0_8_;
                auVar119._12_4_ = auVar153._12_4_;
                local_168 = fVar142;
                fStack_164 = fVar154;
                fStack_160 = fVar155;
                fStack_15c = fVar177;
              }
            }
            uStack_1b0 = CONCAT44(fStack_36c,fStack_370);
            local_1b8 = CONCAT44(fStack_374,local_378);
            uStack_1c0 = CONCAT44(fStack_35c,fStack_360);
            local_1c8._4_4_ = fStack_364;
            local_1c8._0_4_ = local_368;
            uVar46 = movmskps(iVar34,auVar119);
            puVar37 = (undefined1 *)(ulong)uVar46;
            if (uVar46 == 0) goto LAB_00ba00b4;
            fVar157 = (auVar128._0_4_ - fVar157) * local_158 + fVar157;
            fVar172 = (auVar128._4_4_ - fVar172) * fStack_154 + fVar172;
            fVar174 = (auVar128._8_4_ - fVar174) * fStack_150 + fVar174;
            fVar176 = (auVar128._12_4_ - fVar176) * fStack_14c + fVar176;
            fVar89 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
            local_1a8._0_4_ = -(uint)(fVar89 * (fVar157 + fVar157) < local_168) & auVar119._0_4_;
            local_1a8._4_4_ = -(uint)(fVar89 * (fVar172 + fVar172) < fStack_164) & auVar119._4_4_;
            local_1a8._8_4_ = -(uint)(fVar89 * (fVar174 + fVar174) < fStack_160) & auVar119._8_4_;
            local_1a8._12_4_ = -(uint)(fVar89 * (fVar176 + fVar176) < fStack_15c) & auVar119._12_4_;
            uVar48 = movmskps(uVar46,local_1a8);
            if (uVar48 != 0) {
              local_298 = local_298 + local_298 + -1.0;
              fStack_294 = fStack_294 + fStack_294 + -1.0;
              fStack_290 = fStack_290 + fStack_290 + -1.0;
              fStack_28c = fStack_28c + fStack_28c + -1.0;
              local_228 = local_158;
              fStack_224 = fStack_154;
              fStack_220 = fStack_150;
              fStack_21c = fStack_14c;
              local_208 = local_168;
              fStack_204 = fStack_164;
              fStack_200 = fStack_160;
              fStack_1fc = fStack_15c;
              local_1d8 = local_258;
              fStack_1d4 = fStack_254;
              uStack_1d0 = CONCAT44(fStack_24c,fStack_250);
              pGVar39 = (context->scene->geometries).items[local_390].ptr;
              if ((pGVar39->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                bVar45 = false;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar45 = true, pGVar39->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar89 = (float)(int)local_1f8;
                local_198[0] = (fVar89 + local_158 + 0.0) * local_88;
                local_198[1] = (fVar89 + fStack_154 + 1.0) * fStack_84;
                local_198[2] = (fVar89 + fStack_150 + 2.0) * fStack_80;
                local_198[3] = (fVar89 + fStack_14c + 3.0) * fStack_7c;
                local_188 = CONCAT44(fStack_294,local_298);
                uStack_180 = CONCAT44(fStack_28c,fStack_290);
                local_178 = CONCAT44(fStack_164,local_168);
                uStack_170 = CONCAT44(fStack_15c,fStack_160);
                uVar41 = (ulong)(byte)uVar48;
                uVar42 = 0;
                if (uVar41 != 0) {
                  for (; ((byte)uVar48 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                  }
                }
                auVar65 = *local_320;
                local_3d8 = 1;
                local_218 = local_298;
                fStack_214 = fStack_294;
                fStack_210 = fStack_290;
                fStack_20c = fStack_28c;
                local_1f4 = iVar7;
                local_1e8 = fVar121;
                fStack_1e4 = fVar53;
                fStack_1e0 = fVar54;
                fStack_1dc = fVar88;
                do {
                  local_e8 = local_198[uVar42];
                  uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_d8 = *(undefined4 *)((long)&local_188 + uVar42 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) =
                       *(undefined4 *)((long)&local_178 + uVar42 * 4);
                  fVar109 = 1.0 - local_e8;
                  fVar89 = local_e8 * fVar109 * 4.0;
                  fVar120 = (fVar109 * fVar109 + fVar89) * 0.5;
                  fVar91 = local_e8 * local_e8 * 0.5;
                  fVar92 = (-local_e8 * local_e8 - fVar89) * 0.5;
                  local_318.context = context->user;
                  fVar89 = -fVar109 * fVar109 * 0.5;
                  local_118 = fVar89 * fVar121 +
                              fVar92 * fVar244 + fVar120 * fVar230 + fVar91 * fVar227;
                  local_108 = fVar89 * fVar53 +
                              fVar92 * fVar247 + fVar120 * fVar238 + fVar91 * fVar228;
                  local_f8 = fVar89 * fVar54 +
                             fVar92 * fVar253 + fVar120 * fVar241 + fVar91 * fVar229;
                  fStack_114 = local_118;
                  fStack_110 = local_118;
                  fStack_10c = local_118;
                  fStack_104 = local_108;
                  fStack_100 = local_108;
                  fStack_fc = local_108;
                  fStack_f4 = local_f8;
                  fStack_f0 = local_f8;
                  fStack_ec = local_f8;
                  fStack_e4 = local_e8;
                  fStack_e0 = local_e8;
                  fStack_dc = local_e8;
                  uStack_d4 = local_d8;
                  uStack_d0 = local_d8;
                  uStack_cc = local_d8;
                  local_c8 = local_2d8;
                  uStack_c0 = CONCAT44(uStack_2cc,uStack_2d0);
                  local_b8 = local_2e8._0_8_;
                  uStack_b0 = local_2e8._8_8_;
                  local_a8 = (local_318.context)->instID[0];
                  uStack_a4 = local_a8;
                  uStack_a0 = local_a8;
                  uStack_9c = local_a8;
                  local_98 = (local_318.context)->instPrimID[0];
                  uStack_94 = local_98;
                  uStack_90 = local_98;
                  uStack_8c = local_98;
                  local_498 = auVar65._0_8_;
                  uStack_490 = auVar65._8_8_;
                  local_3a8 = local_498;
                  uStack_3a0 = uStack_490;
                  local_318.valid = (int *)&local_3a8;
                  local_318.geometryUserPtr = pGVar39->userPtr;
                  local_318.hit = (RTCHitN *)&local_118;
                  local_318.N = 4;
                  p_Var35 = pGVar39->occlusionFilterN;
                  local_318.ray = (RTCRayN *)ray;
                  if (p_Var35 != (RTCFilterFunctionN)0x0) {
                    p_Var35 = (RTCFilterFunctionN)(*p_Var35)(&local_318);
                  }
                  auVar84._0_4_ = -(uint)((int)local_3a8 == 0);
                  auVar84._4_4_ = -(uint)(local_3a8._4_4_ == 0);
                  auVar84._8_4_ = -(uint)((int)uStack_3a0 == 0);
                  auVar84._12_4_ = -(uint)(uStack_3a0._4_4_ == 0);
                  uVar46 = movmskps((int)p_Var35,auVar84);
                  pRVar36 = (RTCRayN *)(ulong)(uVar46 ^ 0xf);
                  if ((uVar46 ^ 0xf) == 0) {
                    auVar84 = auVar84 ^ _DAT_01febe20;
                  }
                  else {
                    p_Var35 = context->args->filter;
                    if ((p_Var35 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar39->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var35)(&local_318);
                    }
                    auVar108._0_4_ = -(uint)((int)local_3a8 == 0);
                    auVar108._4_4_ = -(uint)(local_3a8._4_4_ == 0);
                    auVar108._8_4_ = -(uint)((int)uStack_3a0 == 0);
                    auVar108._12_4_ = -(uint)(uStack_3a0._4_4_ == 0);
                    auVar84 = auVar108 ^ _DAT_01febe20;
                    *(undefined1 (*) [16])(local_318.ray + 0x80) =
                         ~auVar108 & _DAT_01feba00 |
                         *(undefined1 (*) [16])(local_318.ray + 0x80) & auVar108;
                    pRVar36 = local_318.ray;
                  }
                  auVar85._0_4_ = auVar84._0_4_ << 0x1f;
                  auVar85._4_4_ = auVar84._4_4_ << 0x1f;
                  auVar85._8_4_ = auVar84._8_4_ << 0x1f;
                  auVar85._12_4_ = auVar84._12_4_ << 0x1f;
                  uVar48 = movmskps((int)pRVar36,auVar85);
                  bVar45 = local_3d8._0_1_;
                  if (uVar48 != 0) break;
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar6;
                  uVar41 = uVar41 ^ 1L << (uVar42 & 0x3f);
                  uVar42 = 0;
                  if (uVar41 != 0) {
                    for (; (uVar41 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                    }
                  }
                  bVar45 = uVar41 != 0;
                  uVar48 = (uint)bVar45;
                  local_3d8 = uVar48;
                } while (bVar45);
              }
              bVar44 = (bool)(bVar44 | bVar45);
            }
          }
          lVar40 = lVar40 + 4;
        } while ((int)lVar40 < iVar7);
      }
      if (bVar44 != false) {
        return local_4e9;
      }
      fVar121 = *(float *)(ray + k * 4 + 0x80);
      auVar106._4_4_ = -(uint)(fStack_44 <= fVar121);
      auVar106._0_4_ = -(uint)(local_48 <= fVar121);
      auVar106._8_4_ = -(uint)(fStack_40 <= fVar121);
      auVar106._12_4_ = -(uint)(fStack_3c <= fVar121);
      uVar46 = movmskps(uVar48,auVar106);
      uVar46 = (uint)uVar43 & uVar46;
      local_4e9 = uVar46 != 0;
    } while (local_4e9);
  }
  return local_4e9;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }